

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::LayerNorm_x86_avx512::forward_inplace
          (LayerNorm_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  undefined1 (*pauVar4) [64];
  undefined1 (*pauVar5) [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 (*pauVar25) [64];
  uint *puVar26;
  ulong uVar27;
  int iVar28;
  undefined1 (*pauVar29) [64];
  uint *puVar30;
  long lVar31;
  int iVar32;
  undefined1 (*pauVar33) [64];
  ulong uVar34;
  int q;
  int iVar35;
  int iVar36;
  undefined1 (*pauVar37) [64];
  uint *puVar38;
  int i;
  ulong uVar39;
  undefined1 (*pauVar40) [64];
  ulong uVar41;
  undefined1 (*pauVar42) [64];
  undefined1 auVar53 [32];
  undefined1 auVar43 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar49 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  float fVar112;
  float _mean;
  float fVar114;
  undefined1 auVar113 [64];
  float fVar115;
  float fVar140;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar141;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar145;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined4 uVar160;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar63 [64];
  undefined1 auVar83 [64];
  undefined1 auVar70 [64];
  undefined1 auVar73 [64];
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar103 [64];
  undefined1 auVar106 [64];
  
  auVar113 = _DAT_004fa7c0;
  iVar32 = bottom_top_blob->elempack;
  iVar35 = bottom_top_blob->dims;
  iVar28 = bottom_top_blob->w;
  pp_Var2 = this->_vptr_LayerNorm_x86_avx512;
  p_Var3 = pp_Var2[-3];
  pauVar4 = *(undefined1 (**) [64])(&this->field_0xe0 + (long)p_Var3);
  pauVar5 = *(undefined1 (**) [64])(&this->field_0x128 + (long)p_Var3);
  if (iVar35 == 1) {
    iVar28 = iVar28 * iVar32;
    pauVar25 = (undefined1 (*) [64])bottom_top_blob->data;
    auVar113 = ZEXT1664(ZEXT816(0) << 0x40);
    pauVar42 = pauVar25;
    iVar32 = 0;
    while (iVar32 + 0x10 <= iVar28) {
      auVar113 = vaddps_avx512f(auVar113,*pauVar42);
      pauVar42 = pauVar42 + 1;
      iVar32 = iVar32 + 0x10;
    }
    fVar112 = 0.0;
    fVar141 = 0.0;
    fVar115 = 0.0;
    fVar140 = 0.0;
    fVar142 = 0.0;
    fVar143 = 0.0;
    fVar144 = 0.0;
    fVar145 = 0.0;
    while (iVar32 + 8 <= iVar28) {
      fVar115 = fVar115 + *(float *)*pauVar42;
      fVar140 = fVar140 + *(float *)(*pauVar42 + 4);
      fVar112 = fVar112 + *(float *)(*pauVar42 + 8);
      fVar141 = fVar141 + *(float *)(*pauVar42 + 0xc);
      fVar142 = fVar142 + *(float *)(*pauVar42 + 0x10);
      fVar143 = fVar143 + *(float *)(*pauVar42 + 0x14);
      fVar144 = fVar144 + *(float *)(*pauVar42 + 0x18);
      fVar145 = fVar145 + *(float *)(*pauVar42 + 0x1c);
      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
      iVar32 = iVar32 + 8;
    }
    auVar43 = ZEXT816(0) << 0x40;
    while (iVar32 + 4 <= iVar28) {
      auVar47._0_4_ = auVar43._0_4_ + *(float *)*pauVar42;
      auVar47._4_4_ = auVar43._4_4_ + *(float *)(*pauVar42 + 4);
      auVar47._8_4_ = auVar43._8_4_ + *(float *)(*pauVar42 + 8);
      auVar47._12_4_ = auVar43._12_4_ + *(float *)(*pauVar42 + 0xc);
      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
      iVar32 = iVar32 + 4;
      auVar43 = auVar47;
    }
    fVar151 = 0.0;
    for (; iVar32 < iVar28; iVar32 = iVar32 + 1) {
      fVar151 = fVar151 + *(float *)*pauVar42;
      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
    }
    auVar52 = vextractf64x4_avx512f(auVar113,1);
    fVar114 = auVar113._4_4_ + auVar52._4_4_;
    auVar44._0_4_ = auVar113._0_4_ + auVar52._0_4_ + auVar113._16_4_ + auVar52._16_4_;
    auVar44._4_4_ = fVar114 + fVar114;
    auVar44._8_4_ = auVar113._8_4_ + auVar52._8_4_ + auVar113._24_4_ + auVar52._24_4_;
    auVar44._12_4_ = auVar113._12_4_ + auVar52._12_4_ + auVar113._28_4_ + auVar52._28_4_;
    auVar47 = vshufpd_avx(auVar44,auVar44,1);
    auVar46._0_4_ = auVar47._0_4_ + auVar44._0_4_;
    auVar46._4_4_ = auVar47._4_4_ + auVar44._4_4_;
    auVar46._8_4_ = auVar47._8_4_ + auVar44._8_4_;
    auVar46._12_4_ = auVar47._12_4_ + auVar44._12_4_;
    auVar45._0_4_ = fVar142 + fVar115;
    auVar45._4_4_ = fVar143 + fVar140;
    auVar45._8_4_ = fVar144 + fVar112;
    auVar45._12_4_ = fVar145 + fVar141;
    auVar47 = vshufps_avx(auVar43,auVar45,0x11);
    auVar43 = vshufps_avx(auVar43,auVar45,0xbb);
    auVar48._0_4_ = auVar43._0_4_ + auVar47._0_4_;
    auVar48._4_4_ = auVar43._4_4_ + auVar47._4_4_;
    auVar48._8_4_ = auVar43._8_4_ + auVar47._8_4_;
    auVar48._12_4_ = auVar43._12_4_ + auVar47._12_4_;
    auVar43 = vshufpd_avx(auVar48,auVar48,1);
    auVar126._0_4_ = auVar48._0_4_ + auVar43._0_4_;
    auVar126._4_4_ = auVar48._4_4_ + auVar43._4_4_;
    auVar126._8_4_ = auVar48._8_4_ + auVar43._8_4_;
    auVar126._12_4_ = auVar48._12_4_ + auVar43._12_4_;
    auVar43 = vhaddps_avx(auVar126,auVar126);
    auVar47 = vmovshdup_avx(auVar46);
    auVar43._0_4_ = (auVar46._0_4_ + auVar47._0_4_ + fVar151 + auVar43._0_4_) / (float)iVar28;
    auVar43._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar113 = vbroadcastss_avx512f(auVar43);
    auVar54 = ZEXT1264(ZEXT812(0));
    pauVar42 = pauVar25;
    iVar32 = 0;
    while (iVar32 + 0x10 <= iVar28) {
      auVar55 = vsubps_avx512f(*pauVar42,auVar113);
      auVar54 = vfmadd231ps_avx512f(auVar54,auVar55,auVar55);
      pauVar42 = pauVar42 + 1;
      iVar32 = iVar32 + 0x10;
    }
    uVar160 = auVar113._0_4_;
    auVar52._4_4_ = uVar160;
    auVar52._0_4_ = uVar160;
    auVar52._8_4_ = uVar160;
    auVar52._12_4_ = uVar160;
    auVar52._16_4_ = uVar160;
    auVar52._20_4_ = uVar160;
    auVar52._24_4_ = uVar160;
    auVar52._28_4_ = uVar160;
    auVar47 = ZEXT816(0) << 0x40;
    while (iVar32 + 8 <= iVar28) {
      auVar49 = vsubps_avx(*(undefined1 (*) [32])*pauVar42,auVar52);
      auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar49,auVar49);
      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
      iVar32 = iVar32 + 8;
    }
    auVar44 = ZEXT416(0) << 0x20;
    while( true ) {
      if (iVar28 < iVar32 + 4) break;
      auVar46 = vsubps_avx(*(undefined1 (*) [16])*pauVar42,auVar113._0_16_);
      auVar44 = vfmadd231ps_fma(auVar44,auVar46,auVar46);
      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
      iVar32 = iVar32 + 4;
    }
    auVar46 = ZEXT816(0) << 0x40;
    for (; iVar32 < iVar28; iVar32 = iVar32 + 1) {
      auVar45 = ZEXT416((uint)(*(float *)*pauVar42 - auVar43._0_4_));
      auVar46 = vfmadd231ss_fma(auVar46,auVar45,auVar45);
      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
    }
    auVar52 = vextractf64x4_avx512f(auVar54,1);
    fVar112 = auVar54._4_4_ + auVar52._4_4_;
    auVar148._0_4_ = auVar54._0_4_ + auVar52._0_4_ + auVar54._16_4_ + auVar52._16_4_;
    auVar148._4_4_ = fVar112 + fVar112;
    auVar148._8_4_ = auVar54._8_4_ + auVar52._8_4_ + auVar54._24_4_ + auVar52._24_4_;
    auVar148._12_4_ = auVar54._12_4_ + auVar52._12_4_ + auVar54._28_4_ + auVar52._28_4_;
    auVar45 = vshufpd_avx(auVar148,auVar148,1);
    auVar149._0_4_ = auVar45._0_4_ + auVar148._0_4_;
    auVar149._4_4_ = auVar45._4_4_ + auVar148._4_4_;
    auVar149._8_4_ = auVar45._8_4_ + auVar148._8_4_;
    auVar149._12_4_ = auVar45._12_4_ + auVar148._12_4_;
    auVar154._0_4_ = auVar47._0_4_ + 0.0;
    auVar154._4_4_ = auVar47._4_4_ + 0.0;
    auVar154._8_4_ = auVar47._8_4_ + 0.0;
    auVar154._12_4_ = auVar47._12_4_ + 0.0;
    auVar47 = vshufps_avx(auVar44,auVar154,0x11);
    auVar44 = vshufps_avx(auVar44,auVar154,0xbb);
    auVar155._0_4_ = auVar44._0_4_ + auVar47._0_4_;
    auVar155._4_4_ = auVar44._4_4_ + auVar47._4_4_;
    auVar155._8_4_ = auVar44._8_4_ + auVar47._8_4_;
    auVar155._12_4_ = auVar44._12_4_ + auVar47._12_4_;
    auVar47 = vshufpd_avx(auVar155,auVar155,1);
    auVar156._0_4_ = auVar155._0_4_ + auVar47._0_4_;
    auVar156._4_4_ = auVar155._4_4_ + auVar47._4_4_;
    auVar156._8_4_ = auVar155._8_4_ + auVar47._8_4_;
    auVar156._12_4_ = auVar155._12_4_ + auVar47._12_4_;
    auVar47 = vhaddps_avx(auVar156,auVar156);
    auVar44 = vmovshdup_avx(auVar149);
    fVar112 = (auVar149._0_4_ + auVar44._0_4_ + auVar46._0_4_ + auVar47._0_4_) / (float)iVar28 +
              *(float *)(&this->field_0xd4 + (long)p_Var3);
    auVar47 = vrsqrtss_avx(ZEXT416((uint)fVar112),ZEXT416((uint)fVar112));
    auVar44 = vfmadd213ss_fma(ZEXT416((uint)(fVar112 * auVar47._0_4_)),auVar47,ZEXT416(0xc0400000));
    fVar112 = auVar47._0_4_ * -0.5 * auVar44._0_4_;
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar43 = vxorps_avx512vl(auVar43,auVar9);
    fVar141 = fVar112 * auVar43._0_4_;
    auVar43 = ZEXT416((uint)fVar112);
    auVar113 = vbroadcastss_avx512f(auVar43);
    auVar54 = vbroadcastss_avx512f(ZEXT416((uint)fVar141));
    uVar160 = auVar113._0_4_;
    auVar127._0_4_ = auVar54._0_4_;
    if (*(int *)(&this->field_0xd8 + (long)p_Var3) == 0) {
      iVar32 = 0;
      while (iVar32 + 0x10 <= iVar28) {
        auVar55 = vfmadd132ps_avx512f(*pauVar25,auVar54,auVar113);
        *pauVar25 = auVar55;
        pauVar25 = pauVar25 + 1;
        iVar32 = iVar32 + 0x10;
      }
      auVar159._4_4_ = uVar160;
      auVar159._0_4_ = uVar160;
      auVar159._8_4_ = uVar160;
      auVar159._12_4_ = uVar160;
      auVar49._4_4_ = auVar127._0_4_;
      auVar49._0_4_ = auVar127._0_4_;
      auVar49._8_4_ = auVar127._0_4_;
      auVar49._12_4_ = auVar127._0_4_;
      auVar49._16_4_ = auVar127._0_4_;
      auVar49._20_4_ = auVar127._0_4_;
      auVar49._24_4_ = auVar127._0_4_;
      auVar49._28_4_ = auVar127._0_4_;
      while (iVar32 + 8 <= iVar28) {
        auVar47 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar25,auVar49,auVar113._0_32_);
        *(undefined1 (*) [32])*pauVar25 = ZEXT1632(auVar47);
        pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
        iVar32 = iVar32 + 8;
      }
      auVar133._4_4_ = auVar127._0_4_;
      auVar133._0_4_ = auVar127._0_4_;
      auVar133._8_4_ = auVar127._0_4_;
      auVar133._12_4_ = auVar127._0_4_;
      while (iVar32 + 4 <= iVar28) {
        auVar47 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar25,auVar133,auVar159);
        *(undefined1 (*) [16])*pauVar25 = auVar47;
        pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
        iVar32 = iVar32 + 4;
      }
      for (; iVar32 < iVar28; iVar32 = iVar32 + 1) {
        auVar47 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar25),ZEXT416((uint)fVar141),auVar43);
        *(int *)*pauVar25 = auVar47._0_4_;
        pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
      }
    }
    else {
      for (uVar27 = 0; (int)uVar27 + 0x10 <= iVar28; uVar27 = uVar27 + 0x10) {
        auVar55 = vfmadd132ps_avx512f(*(undefined1 (*) [64])(*pauVar25 + uVar27 * 4),auVar54,
                                      auVar113);
        auVar55 = vfmadd213ps_avx512f(auVar55,*(undefined1 (*) [64])(*pauVar4 + uVar27 * 4),
                                      *(undefined1 (*) [64])(*pauVar5 + uVar27 * 4));
        *(undefined1 (*) [64])(*pauVar25 + uVar27 * 4) = auVar55;
      }
      auVar157._4_4_ = uVar160;
      auVar157._0_4_ = uVar160;
      auVar157._8_4_ = uVar160;
      auVar157._12_4_ = uVar160;
      auVar50._4_4_ = auVar127._0_4_;
      auVar50._0_4_ = auVar127._0_4_;
      auVar50._8_4_ = auVar127._0_4_;
      auVar50._12_4_ = auVar127._0_4_;
      auVar50._16_4_ = auVar127._0_4_;
      auVar50._20_4_ = auVar127._0_4_;
      auVar50._24_4_ = auVar127._0_4_;
      auVar50._28_4_ = auVar127._0_4_;
      for (; (int)uVar27 + 8 <= iVar28; uVar27 = uVar27 + 8) {
        auVar47 = vfmadd132ps_fma(*(undefined1 (*) [32])(*pauVar25 + uVar27 * 4),auVar50,
                                  auVar113._0_32_);
        auVar47 = vfmadd213ps_fma(ZEXT1632(auVar47),*(undefined1 (*) [32])(*pauVar4 + uVar27 * 4),
                                  *(undefined1 (*) [32])(*pauVar5 + uVar27 * 4));
        *(undefined1 (*) [32])(*pauVar25 + uVar27 * 4) = ZEXT1632(auVar47);
      }
      auVar127._4_4_ = auVar127._0_4_;
      auVar127._8_4_ = auVar127._0_4_;
      auVar127._12_4_ = auVar127._0_4_;
      for (; (int)uVar27 + 4 <= iVar28; uVar27 = uVar27 + 4) {
        auVar47 = vfmadd132ps_fma(*(undefined1 (*) [16])(*pauVar25 + uVar27 * 4),auVar127,auVar157);
        auVar47 = vfmadd213ps_fma(auVar47,*(undefined1 (*) [16])(*pauVar4 + uVar27 * 4),
                                  *(undefined1 (*) [16])(*pauVar5 + uVar27 * 4));
        *(undefined1 (*) [16])(*pauVar25 + uVar27 * 4) = auVar47;
      }
      lVar31 = 0;
      for (uVar41 = uVar27 & 0xffffffff; (int)uVar41 < iVar28; uVar41 = (ulong)((int)uVar41 + 1)) {
        auVar47 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar25 + uVar27 * 4 + lVar31)),
                                  ZEXT416((uint)fVar141),auVar43);
        auVar47 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar4 + uVar27 * 4 + lVar31)),auVar47,
                                  ZEXT416(*(uint *)(*pauVar5 + uVar27 * 4 + lVar31)));
        *(int *)(*pauVar25 + uVar27 * 4 + lVar31) = auVar47._0_4_;
        lVar31 = lVar31 + 4;
      }
    }
  }
  else {
    uVar1 = bottom_top_blob->h;
    if (iVar35 == 3) {
      uVar41 = 0;
      uVar27 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar27 = uVar41;
      }
      if (*(int *)(&this->field_0xd0 + (long)p_Var3) == iVar28) {
        iVar35 = iVar28 * iVar32;
        fVar112 = 1.0 / (float)iVar28;
        auVar54 = vbroadcastss_avx512f(ZEXT416((uint)fVar112));
        uVar34 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar34 = uVar41;
        }
        auVar153._8_4_ = 0x80000000;
        auVar153._0_8_ = 0x8000000080000000;
        auVar153._12_4_ = 0x80000000;
        auVar162._8_4_ = 0xc0400000;
        auVar162._0_8_ = 0xc0400000c0400000;
        auVar162._12_4_ = 0xc0400000;
        auVar165._8_4_ = 0xc0400000;
        auVar165._0_8_ = 0xc0400000c0400000;
        auVar165._12_4_ = 0xc0400000;
        auVar165._16_4_ = 0xc0400000;
        auVar165._20_4_ = 0xc0400000;
        auVar165._24_4_ = 0xc0400000;
        auVar165._28_4_ = 0xc0400000;
        auVar58 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
        auVar56 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
        auVar57 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar83._12_4_ = 0;
        auVar83._0_12_ = ZEXT812(0);
        auVar55 = auVar57;
        for (; uVar41 != uVar27; uVar41 = uVar41 + 1) {
          pp_Var2 = this->_vptr_LayerNorm_x86_avx512;
          for (uVar39 = 0; uVar39 != uVar34; uVar39 = uVar39 + 1) {
            pauVar42 = (undefined1 (*) [64])
                       ((long)bottom_top_blob->data +
                       (long)bottom_top_blob->w * uVar39 * bottom_top_blob->elemsize +
                       bottom_top_blob->cstep * uVar41 * bottom_top_blob->elemsize);
            pauVar25 = pauVar42;
            auVar166 = ZEXT1664(ZEXT816(0) << 0x40);
            iVar28 = 0;
            while (iVar28 + 0x10 <= iVar35) {
              auVar55 = vaddps_avx512f(auVar166,*pauVar25);
              pauVar25 = pauVar25 + 1;
              auVar166 = auVar55;
              iVar28 = iVar28 + 0x10;
            }
            auVar79._16_48_ = auVar55._16_48_;
            auVar79._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
            auVar55 = ZEXT1664(auVar79._0_16_);
            while( true ) {
              auVar52 = auVar55._0_32_;
              if (iVar35 < iVar28 + 8) break;
              auVar79._0_32_ = vaddps_avx512vl(auVar52,*(undefined1 (*) [32])*pauVar25);
              auVar55 = ZEXT3264(auVar79._0_32_);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
              iVar28 = iVar28 + 8;
            }
            auVar80._16_48_ = auVar79._16_48_;
            auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
            while (iVar28 + 4 <= iVar35) {
              auVar43 = vaddps_avx512vl(auVar43,*(undefined1 (*) [16])*pauVar25);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
              iVar28 = iVar28 + 4;
            }
            auVar80._0_16_ = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
            auVar47 = auVar80._0_16_;
            for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
              auVar80._0_16_ = vaddss_avx512f(auVar47,ZEXT416(*(uint *)*pauVar25));
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
              auVar47 = auVar80._0_16_;
            }
            if (iVar32 == 0x10) {
              auVar55 = vmulps_avx512f(auVar166,auVar54);
              auVar52 = vbroadcastss_avx512vl(auVar55._0_16_);
              bVar21 = true;
              bVar23 = false;
              bVar24 = false;
              auVar44 = auVar52._0_16_;
              bVar22 = false;
              auVar166 = auVar55;
              in_ZMM18 = auVar55;
            }
            else {
              auVar81._32_32_ = auVar80._32_32_;
              auVar49 = vextractf64x4_avx512f(auVar166,1);
              auVar50 = auVar166._0_32_;
              if (iVar32 == 4) {
                auVar52 = vaddps_avx512vl(auVar50,auVar52);
                auVar52 = vaddps_avx512vl(auVar52,auVar49);
                auVar43 = vaddps_avx512vl(auVar52._0_16_,auVar43);
                auVar121._0_4_ = auVar52._16_4_ + auVar43._0_4_;
                auVar121._4_4_ = auVar52._20_4_ + auVar43._4_4_;
                auVar121._8_4_ = auVar52._24_4_ + auVar43._8_4_;
                auVar121._12_4_ = auVar52._28_4_ + auVar43._12_4_;
                auVar44 = vmulps_avx512vl(auVar121,auVar54._0_16_);
                auVar166 = ZEXT1664(auVar44);
                auVar52 = vinsertf32x4_avx512vl(ZEXT1632(auVar44),auVar44,1);
                auVar55 = ZEXT3264(auVar52);
                bVar23 = true;
                bVar24 = false;
                in_ZMM18 = auVar166;
LAB_0047eca6:
                bVar22 = false;
              }
              else {
                if (iVar32 != 8) {
                  auVar46 = auVar55._0_16_;
                  if (iVar32 == 1) {
                    auVar49 = vaddps_avx512vl(auVar50,auVar49);
                    auVar44 = vextractf32x4_avx512vl(auVar49,1);
                    auVar44 = vaddps_avx512vl(auVar49._0_16_,auVar44);
                    auVar45 = vshufpd_avx512vl(auVar44,auVar44,1);
                    auVar44 = vaddps_avx512vl(auVar45,auVar44);
                    auVar45 = vextractf32x4_avx512vl(auVar52,1);
                    auVar46 = vaddps_avx512vl(auVar45,auVar46);
                    auVar45 = vshufps_avx512vl(auVar43,auVar46,0x11);
                    auVar43 = vshufps_avx512vl(auVar43,auVar46,0xbb);
                    auVar43 = vaddps_avx512vl(auVar43,auVar45);
                    auVar46 = vshufpd_avx512vl(auVar43,auVar43,1);
                    auVar43 = vaddps_avx512vl(auVar43,auVar46);
                    auVar43 = vhaddps_avx(auVar43,auVar43);
                    auVar46 = vmovshdup_avx512vl(auVar44);
                    auVar46 = vaddss_avx512f(auVar46,auVar47);
                    auVar44 = vaddss_avx512f(auVar44,auVar46);
                    auVar43 = vmulss_avx512f(ZEXT416((uint)(auVar44._0_4_ + auVar43._0_4_)),
                                             ZEXT416((uint)fVar112));
                    auVar81._0_32_ = vbroadcastss_avx512vl(auVar43);
                    auVar55 = ZEXT3264(auVar81._0_32_);
                    auVar83._16_48_ = auVar81._16_48_;
                    auVar82._4_60_ = auVar83._4_60_;
                    auVar82._0_4_ = auVar81._0_4_;
                    auVar166 = ZEXT1664(auVar82._0_16_);
                    bVar24 = true;
                    bVar23 = false;
                    auVar44 = auVar81._0_16_;
                    in_ZMM18 = ZEXT1664(auVar43);
                  }
                  else {
                    auVar44 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
                    auVar166 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar43 = vxorps_avx512vl(auVar43,auVar43);
                    auVar46 = vxorps_avx512vl(auVar46,auVar46);
                    auVar55 = ZEXT1664(auVar46);
                    bVar23 = false;
                    bVar24 = false;
                    in_ZMM18 = ZEXT1664(auVar43);
                  }
                  goto LAB_0047eca6;
                }
                auVar52 = vaddps_avx512vl(auVar50,auVar52);
                auVar52 = vaddps_avx512vl(auVar52,auVar49);
                auVar52 = vmulps_avx512vl(auVar52,auVar54._0_32_);
                auVar166 = ZEXT3264(auVar52);
                auVar44 = vbroadcastss_avx512vl(auVar52._0_16_);
                bVar22 = true;
                bVar23 = false;
                in_ZMM18 = ZEXT1664(auVar52._0_16_);
                bVar24 = false;
                auVar55 = auVar166;
              }
              auVar52 = auVar55._0_32_;
              auVar55 = vinsertf64x4_avx512f(auVar55,auVar52,1);
              bVar21 = false;
            }
            auVar84._16_48_ = auVar55._16_48_;
            auVar84._0_16_ = vxorps_avx512vl(auVar47,auVar47);
            pauVar25 = pauVar42;
            in_ZMM19 = ZEXT1664(auVar84._0_16_);
            iVar28 = 0;
            while (iVar28 + 0x10 <= iVar35) {
              auVar64 = vsubps_avx512f(*pauVar25,auVar55);
              auVar84 = vfmadd231ps_avx512f(in_ZMM19,auVar64,auVar64);
              pauVar25 = pauVar25 + 1;
              in_ZMM19 = auVar84;
              iVar28 = iVar28 + 0x10;
            }
            auVar85._16_48_ = auVar84._16_48_;
            auVar85._0_16_ = vxorps_avx512vl(auVar55._0_16_,auVar55._0_16_);
            auVar55 = ZEXT1664(auVar85._0_16_);
            while( true ) {
              auVar49 = auVar55._0_32_;
              if (iVar35 < iVar28 + 8) break;
              auVar50 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar25,auVar52);
              auVar85._0_32_ = vfmadd231ps_avx512vl(auVar49,auVar50,auVar50);
              auVar55 = ZEXT3264(auVar85._0_32_);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
              iVar28 = iVar28 + 8;
            }
            auVar43 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
            while (iVar28 + 4 <= iVar35) {
              auVar47 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar25,auVar44);
              auVar43 = vfmadd231ps_avx512vl(auVar43,auVar47,auVar47);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
              iVar28 = iVar28 + 4;
            }
            auVar47 = vxorps_avx512vl(auVar44,auVar44);
            while( true ) {
              in_ZMM21 = ZEXT1664(auVar47);
              if (iVar35 <= iVar28) break;
              auVar44 = vsubss_avx512f(ZEXT416(*(uint *)*pauVar25),in_ZMM18._0_16_);
              auVar47 = vfmadd231ss_avx512f(auVar47,auVar44,auVar44);
              iVar28 = iVar28 + 1;
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
            }
            if (bVar21) {
              in_ZMM16 = vmulps_avx512f(in_ZMM19,auVar54);
              auVar85._32_32_ = in_ZMM16._32_32_;
            }
            else {
              auVar44 = vxorps_avx512vl(auVar52._0_16_,auVar52._0_16_);
              in_ZMM16 = ZEXT1664(auVar44);
            }
            auVar86._0_32_ = vextractf64x4_avx512f(in_ZMM19,1);
            auVar86._32_32_ = auVar85._32_32_;
            auVar52 = in_ZMM19._0_32_;
            auVar55 = auVar86;
            if (bVar22) {
              auVar49 = vaddps_avx512vl(auVar52,auVar49);
              auVar49 = vaddps_avx512vl(auVar49,auVar86._0_32_);
              auVar50 = vmulps_avx512vl(auVar49,auVar54._0_32_);
              auVar55 = vinsertf64x4_avx512f(in_ZMM16,auVar50,0);
              in_ZMM16 = auVar55;
            }
            if (bVar23) {
              auVar49 = vaddps_avx512vl(auVar52,auVar49);
              auVar49 = vaddps_avx512vl(auVar49,auVar86._0_32_);
              auVar44 = vextractf32x4_avx512vl(auVar49,1);
              auVar43 = vaddps_avx512vl(auVar49._0_16_,auVar43);
              auVar43 = vaddps_avx512vl(auVar43,auVar44);
              auVar44 = vmulps_avx512vl(auVar43,auVar54._0_16_);
              auVar55 = vinsertf32x4_avx512f(in_ZMM16,auVar44,0);
              in_ZMM16 = auVar55;
            }
            if (bVar24) {
              auVar87._32_32_ = auVar55._32_32_;
              auVar87._0_32_ = vaddps_avx512vl(auVar52,auVar86._0_32_);
              auVar89._16_48_ = auVar87._16_48_;
              auVar44 = vextractf32x4_avx512vl(auVar87._0_32_,1);
              auVar46 = vaddps_avx512vl(auVar87._0_16_,auVar44);
              auVar45 = vshufpd_avx512vl(auVar46,auVar46,1);
              auVar44 = vextractf32x4_avx512vl(auVar49,1);
              auVar44 = vaddps_avx512vl(auVar44,auVar49._0_16_);
              auVar48 = vshufps_avx512vl(auVar44,auVar43,0x11);
              auVar43 = vshufps_avx512vl(auVar44,auVar43,0xbb);
              auVar44 = vaddps_avx512vl(auVar43,auVar48);
              auVar43 = vshufpd_avx512vl(auVar44,auVar44,1);
              auVar44 = vaddps_avx512vl(auVar44,auVar43);
              auVar44 = vhaddps_avx(auVar44,auVar44);
              auVar46 = vaddps_avx512vl(auVar45,auVar46);
              auVar45 = vmovshdup_avx512vl(auVar46);
              auVar47 = vaddss_avx512f(auVar45,auVar47);
              in_ZMM19 = ZEXT1664(auVar47);
              auVar47 = vaddss_avx512f(auVar46,auVar47);
              auVar89._0_16_ = in_ZMM16._0_16_;
              auVar88._4_60_ = auVar89._4_60_;
              auVar88._0_4_ = (auVar47._0_4_ + auVar44._0_4_) * fVar112;
              auVar55 = vinsertf32x4_avx512f(in_ZMM16,auVar88._0_16_,0);
              in_ZMM16 = auVar55;
            }
            auVar64 = ZEXT1664(auVar43);
            auVar47 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var2[-3]));
            auVar91._16_48_ = auVar55._16_48_;
            auVar43 = in_ZMM16._0_16_;
            if (iVar32 == 1) {
              auVar44 = vaddss_avx512f(auVar43,auVar47);
              auVar47 = vrsqrtss_avx(auVar44,auVar44);
              auVar44 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar44._0_4_ * auVar47._0_4_)),auVar47,
                                            ZEXT416(0xc0400000));
              auVar47 = vmulss_avx512f(auVar47,ZEXT416(0xbf000000));
              fVar141 = auVar47._0_4_ * auVar44._0_4_;
              auVar91._0_16_ = auVar43;
              auVar90._4_60_ = auVar91._4_60_;
              auVar90._0_4_ = fVar141;
              in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar90._0_16_,0);
              auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,auVar153);
              auVar124._4_12_ = auVar166._4_12_;
              auVar124._0_4_ = fVar141 * auVar43._0_4_;
              auVar55 = vinsertf32x4_avx512f(auVar166,auVar124,0);
              in_ZMM22 = auVar55;
            }
            else if (iVar32 == 4) {
              auVar47 = vbroadcastss_avx512vl(auVar47);
              auVar47 = vaddps_avx512vl(auVar43,auVar47);
              auVar43 = vrsqrtps_avx(auVar47);
              auVar122._0_4_ = auVar47._0_4_ * auVar43._0_4_;
              auVar122._4_4_ = auVar47._4_4_ * auVar43._4_4_;
              auVar122._8_4_ = auVar47._8_4_ * auVar43._8_4_;
              auVar122._12_4_ = auVar47._12_4_ * auVar43._12_4_;
              auVar47 = vfmadd213ps_fma(auVar122,auVar43,auVar162);
              auVar123._0_4_ = auVar43._0_4_ * -0.5 * auVar47._0_4_;
              auVar123._4_4_ = auVar43._4_4_ * -0.5 * auVar47._4_4_;
              auVar123._8_4_ = auVar43._8_4_ * -0.5 * auVar47._8_4_;
              auVar123._12_4_ = auVar43._12_4_ * -0.5 * auVar47._12_4_;
              auVar147._0_4_ = auVar123._0_4_ * -auVar166._0_4_;
              auVar147._4_4_ = auVar123._4_4_ * -auVar166._4_4_;
              auVar147._8_4_ = auVar123._8_4_ * -auVar166._8_4_;
              auVar147._12_4_ = auVar123._12_4_ * -auVar166._12_4_;
              in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar123,0);
              auVar55 = vinsertf32x4_avx512f(auVar166,auVar147,0);
              in_ZMM22 = auVar55;
            }
            else if (iVar32 == 8) {
              auVar52 = vbroadcastss_avx512vl(auVar47);
              auVar49 = vaddps_avx512vl(in_ZMM16._0_32_,auVar52);
              auVar52 = vrsqrtps_avx(auVar49);
              auVar18._4_4_ = auVar49._4_4_ * auVar52._4_4_;
              auVar18._0_4_ = auVar49._0_4_ * auVar52._0_4_;
              auVar18._8_4_ = auVar49._8_4_ * auVar52._8_4_;
              auVar18._12_4_ = auVar49._12_4_ * auVar52._12_4_;
              auVar18._16_4_ = auVar49._16_4_ * auVar52._16_4_;
              auVar18._20_4_ = auVar49._20_4_ * auVar52._20_4_;
              auVar18._24_4_ = auVar49._24_4_ * auVar52._24_4_;
              auVar18._28_4_ = auVar49._28_4_;
              auVar43 = vfmadd213ps_fma(auVar18,auVar52,auVar165);
              auVar136._0_4_ = auVar52._0_4_ * -0.5 * auVar43._0_4_;
              auVar136._4_4_ = auVar52._4_4_ * -0.5 * auVar43._4_4_;
              auVar136._8_4_ = auVar52._8_4_ * -0.5 * auVar43._8_4_;
              auVar136._12_4_ = auVar52._12_4_ * -0.5 * auVar43._12_4_;
              auVar136._16_4_ = auVar52._16_4_ * -0.5 * 0.0;
              auVar136._20_4_ = auVar52._20_4_ * -0.5 * 0.0;
              auVar136._24_4_ = auVar52._24_4_ * -0.5 * 0.0;
              auVar136._28_4_ = 0;
              auVar19._4_4_ = auVar136._4_4_ * -auVar166._4_4_;
              auVar19._0_4_ = auVar136._0_4_ * -auVar166._0_4_;
              auVar19._8_4_ = auVar136._8_4_ * -auVar166._8_4_;
              auVar19._12_4_ = auVar136._12_4_ * -auVar166._12_4_;
              auVar19._16_4_ = auVar136._16_4_ * -auVar166._16_4_;
              auVar19._20_4_ = auVar136._20_4_ * -auVar166._20_4_;
              auVar19._24_4_ = auVar136._24_4_ * -auVar166._24_4_;
              auVar19._28_4_ = auVar166._28_4_ ^ 0x80000000;
              in_ZMM16 = vinsertf64x4_avx512f(in_ZMM16,auVar136,0);
              auVar55 = vinsertf64x4_avx512f(auVar166,auVar19,0);
              in_ZMM22 = auVar55;
            }
            else {
              in_ZMM22 = auVar166;
              if (iVar32 == 0x10) {
                auVar55 = vbroadcastss_avx512f(auVar47);
                auVar55 = vaddps_avx512f(in_ZMM16,auVar55);
                auVar71 = vrsqrt14ps_avx512f(auVar55);
                auVar55 = vmulps_avx512f(auVar55,auVar71);
                auVar55 = vfmadd213ps_avx512f(auVar55,auVar71,auVar58);
                auVar71 = vmulps_avx512f(auVar71,auVar56);
                in_ZMM16 = vmulps_avx512f(auVar71,auVar55);
                auVar55 = vxorps_avx512dq(auVar166,auVar57);
                auVar55 = vmulps_avx512f(in_ZMM16,auVar55);
                in_ZMM22 = auVar55;
              }
            }
            auVar47 = in_ZMM16._0_16_;
            auVar52 = in_ZMM16._0_32_;
            auVar43 = in_ZMM22._0_16_;
            auVar49 = in_ZMM22._0_32_;
            if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
              auVar44 = auVar43;
              auVar46 = auVar47;
              if (!bVar23) {
                auVar46 = vbroadcastss_avx512vl(auVar47);
                auVar44 = vbroadcastss_avx512vl(auVar43);
              }
              in_ZMM19 = ZEXT1664(auVar44);
              in_ZMM18 = ZEXT1664(auVar46);
              if (!bVar22) {
                auVar52 = vinsertf32x4_avx512vl(ZEXT1632(auVar46),auVar46,1);
                auVar49 = vinsertf32x4_avx512vl(ZEXT1632(auVar44),auVar44,1);
              }
              in_ZMM21 = ZEXT3264(auVar49);
              if (!bVar21) {
                in_ZMM16 = vinsertf64x4_avx512f(ZEXT3264(auVar52),auVar52,1);
                in_ZMM22 = vinsertf64x4_avx512f(in_ZMM21,auVar49,1);
              }
              auVar55 = in_ZMM22;
              iVar28 = 0;
              while (iVar28 + 0x10 <= iVar35) {
                auVar55 = vfmadd132ps_avx512f(*pauVar42,in_ZMM22,in_ZMM16);
                *pauVar42 = auVar55;
                pauVar42 = pauVar42 + 1;
                iVar28 = iVar28 + 0x10;
              }
              while (iVar28 + 8 <= iVar35) {
                auVar55._0_32_ =
                     vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar42,auVar49,auVar52);
                *(undefined1 (*) [32])*pauVar42 = auVar55._0_32_;
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
                iVar28 = iVar28 + 8;
              }
              while (iVar28 + 4 <= iVar35) {
                auVar55._0_16_ =
                     vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar42,auVar44,auVar46);
                *(undefined1 (*) [16])*pauVar42 = auVar55._0_16_;
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                iVar28 = iVar28 + 4;
              }
              for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
                auVar55._0_16_ = vfmadd132ss_avx512f(ZEXT416(*(uint *)*pauVar42),auVar43,auVar47);
                *(int *)*pauVar42 = auVar55._0_4_;
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
              }
            }
            else {
              pauVar25 = pauVar4;
              pauVar37 = pauVar5;
              if (bVar21) {
                for (iVar28 = 0x10; iVar28 <= iVar35; iVar28 = iVar28 + 0x10) {
                  auVar55 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar25));
                  auVar166 = vfmadd132ps_avx512f(*pauVar42,in_ZMM22,in_ZMM16);
                  uVar160 = *(undefined4 *)*pauVar37;
                  auVar14._4_4_ = uVar160;
                  auVar14._0_4_ = uVar160;
                  auVar14._8_4_ = uVar160;
                  auVar14._12_4_ = uVar160;
                  auVar14._16_4_ = uVar160;
                  auVar14._20_4_ = uVar160;
                  auVar14._24_4_ = uVar160;
                  auVar14._28_4_ = uVar160;
                  auVar14._32_4_ = uVar160;
                  auVar14._36_4_ = uVar160;
                  auVar14._40_4_ = uVar160;
                  auVar14._44_4_ = uVar160;
                  auVar14._48_4_ = uVar160;
                  auVar14._52_4_ = uVar160;
                  auVar14._56_4_ = uVar160;
                  auVar14._60_4_ = uVar160;
                  auVar55 = vfmadd213ps_avx512f(auVar166,auVar55,auVar14);
                  *pauVar42 = auVar55;
                  pauVar42 = pauVar42 + 1;
                  pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                }
              }
              pauVar29 = pauVar42;
              if (bVar22) {
                auVar166 = vinsertf64x4_avx512f(in_ZMM16,auVar52,1);
                in_ZMM18 = vinsertf64x4_avx512f(in_ZMM22,auVar49,1);
                lVar31 = 0;
                iVar36 = 8;
                iVar28 = 0;
                auVar55 = in_ZMM18;
                while (iVar28 = iVar28 + 0x10, iVar28 <= iVar35) {
                  auVar55 = vpermt2ps_avx512f(ZEXT464(*(uint *)(*pauVar25 + lVar31)),auVar113,
                                              ZEXT464(*(uint *)(*pauVar25 + lVar31 + 4)));
                  in_ZMM19 = vpermt2ps_avx512f(ZEXT464(*(uint *)(*pauVar37 + lVar31)),auVar113,
                                               ZEXT464(*(uint *)(*pauVar37 + lVar31 + 4)));
                  auVar71 = vfmadd132ps_avx512f(*(undefined1 (*) [64])(*pauVar42 + lVar31 * 8),
                                                in_ZMM18,auVar166);
                  auVar55 = vfmadd213ps_avx512f(auVar71,auVar55,in_ZMM19);
                  *(undefined1 (*) [64])(*pauVar42 + lVar31 * 8) = auVar55;
                  pauVar29 = pauVar29 + 1;
                  lVar31 = lVar31 + 8;
                  iVar36 = iVar36 + 0x10;
                }
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar31);
                pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar31);
                for (; iVar36 <= iVar35; iVar36 = iVar36 + 8) {
                  uVar160 = *(undefined4 *)*pauVar25;
                  auVar137._4_4_ = uVar160;
                  auVar137._0_4_ = uVar160;
                  auVar137._8_4_ = uVar160;
                  auVar137._12_4_ = uVar160;
                  auVar137._16_4_ = uVar160;
                  auVar137._20_4_ = uVar160;
                  auVar137._24_4_ = uVar160;
                  auVar137._28_4_ = uVar160;
                  auVar50 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar29,auVar49,auVar52);
                  uVar160 = *(undefined4 *)*pauVar37;
                  auVar11._4_4_ = uVar160;
                  auVar11._0_4_ = uVar160;
                  auVar11._8_4_ = uVar160;
                  auVar11._12_4_ = uVar160;
                  auVar11._16_4_ = uVar160;
                  auVar11._20_4_ = uVar160;
                  auVar11._24_4_ = uVar160;
                  auVar11._28_4_ = uVar160;
                  auVar55._0_32_ = vfmadd213ps_avx512vl(auVar50,auVar137,auVar11);
                  *(undefined1 (*) [32])*pauVar29 = auVar55._0_32_;
                  pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
                  pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                }
              }
              if (bVar23) {
                auVar50 = vpermpd_avx512vl(auVar52,0x44);
                auVar51 = vpermpd_avx512vl(auVar49,0x44);
                in_ZMM18 = ZEXT3264(auVar51);
                auVar55 = vinsertf64x4_avx512f(in_ZMM16,auVar52,1);
                in_ZMM19 = vpermpd_avx512f(auVar55,0x44);
                auVar55 = vinsertf64x4_avx512f(in_ZMM22,auVar49,1);
                auVar166 = vpermpd_avx512f(auVar55,0x44);
                pauVar42 = pauVar29;
                auVar55 = auVar166;
                for (lVar31 = 0; (int)lVar31 + 0x10 <= iVar35; lVar31 = lVar31 + 0x10) {
                  auVar55 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar25 + lVar31 + 8)));
                  auVar64 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar25 + lVar31 + 0xc)));
                  auVar44 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar25 + lVar31)),
                                             ZEXT416(*(uint *)(*pauVar25 + lVar31 + 4)),0);
                  auVar52 = vpermpd_avx512vl(ZEXT1632(auVar44),0x50);
                  auVar55 = vinsertf64x4_avx512f(auVar55,auVar52,0);
                  auVar92._0_48_ = auVar55._0_48_;
                  auVar92._48_8_ = auVar64._48_8_;
                  auVar92._56_8_ = auVar64._56_8_;
                  auVar55 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + lVar31 + 8)));
                  auVar71 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + lVar31 + 0xc)));
                  auVar44 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar37 + lVar31)),
                                             ZEXT416(*(uint *)(*pauVar37 + lVar31 + 4)),0);
                  auVar52 = vpermpd_avx512vl(ZEXT1632(auVar44),0x50);
                  auVar64 = ZEXT3264(auVar52);
                  auVar55 = vinsertf64x4_avx512f(auVar55,auVar52,0);
                  auVar93._0_48_ = auVar55._0_48_;
                  auVar93._48_8_ = auVar71._48_8_;
                  auVar93._56_8_ = auVar71._56_8_;
                  auVar55 = vfmadd132ps_avx512f(*pauVar42,auVar166,in_ZMM19);
                  auVar55 = vfmadd213ps_avx512f(auVar55,auVar92,auVar93);
                  *pauVar42 = auVar55;
                  pauVar42 = pauVar42 + 1;
                  in_ZMM21 = auVar55;
                }
                for (; (int)lVar31 + 8 <= iVar35; lVar31 = lVar31 + 8) {
                  auVar44 = vshufps_avx(ZEXT416(*(uint *)(*pauVar25 + lVar31)),
                                        ZEXT416(*(uint *)(*pauVar25 + lVar31 + 4)),0);
                  auVar46 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar37 + lVar31)),
                                             ZEXT416(*(uint *)(*pauVar37 + lVar31 + 4)),0);
                  auVar52 = vpermpd_avx2(ZEXT1632(auVar44),0x50);
                  auVar49 = vpermpd_avx2(ZEXT1632(auVar46),0x50);
                  auVar99._32_32_ =
                       vfmadd132ps_avx512vl
                                 (*(undefined1 (*) [32])(*pauVar29 + lVar31 * 4),auVar51,auVar50);
                  auVar55._0_32_ = vfmadd213ps_avx512vl(auVar99._32_32_,auVar52,auVar49);
                  in_ZMM19 = ZEXT3264(auVar55._0_32_);
                  *(undefined1 (*) [32])(*pauVar29 + lVar31 * 4) = auVar55._0_32_;
                  pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
                }
                for (; (int)lVar31 + 4 <= iVar35; lVar31 = lVar31 + 4) {
                  uVar160 = *(undefined4 *)(*pauVar25 + lVar31);
                  auVar125._4_4_ = uVar160;
                  auVar125._0_4_ = uVar160;
                  auVar125._8_4_ = uVar160;
                  auVar125._12_4_ = uVar160;
                  auVar44 = vfmadd132ps_avx512vl
                                      (*(undefined1 (*) [16])(*pauVar29 + lVar31 * 4),auVar43,
                                       auVar47);
                  uVar160 = *(undefined4 *)(*pauVar37 + lVar31);
                  auVar7._4_4_ = uVar160;
                  auVar7._0_4_ = uVar160;
                  auVar7._8_4_ = uVar160;
                  auVar7._12_4_ = uVar160;
                  auVar55._0_16_ = vfmadd213ps_avx512vl(auVar44,auVar125,auVar7);
                  *(undefined1 (*) [16])(*pauVar29 + lVar31 * 4) = auVar55._0_16_;
                  pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                }
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar31);
                pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar31);
                pauVar29 = pauVar42;
              }
              in_ZMM22 = auVar64;
              if (bVar24) {
                auVar166 = vbroadcastss_avx512f(auVar47);
                auVar64 = vbroadcastss_avx512f(auVar43);
                lVar31 = 0;
                pauVar42 = pauVar25;
                pauVar33 = pauVar37;
                pauVar40 = pauVar29;
                auVar55 = auVar64;
                iVar28 = 0;
                while (iVar28 + 0x10 <= iVar35) {
                  auVar55 = vfmadd132ps_avx512f(*pauVar40,auVar64,auVar166);
                  auVar55 = vfmadd213ps_avx512f(auVar55,*pauVar42,*pauVar33);
                  *pauVar40 = auVar55;
                  pauVar40 = pauVar40 + 1;
                  pauVar42 = pauVar42 + 1;
                  pauVar33 = pauVar33 + 1;
                  lVar31 = lVar31 + 0x40;
                  iVar28 = iVar28 + 0x10;
                }
                auVar94._32_32_ = auVar55._32_32_;
                auVar94._0_32_ = vbroadcastss_avx512vl(auVar43);
                auVar95 = auVar94;
                while (iVar28 + 8 <= iVar35) {
                  auVar95._0_32_ =
                       vfmadd132ps_avx512vl
                                 (*(undefined1 (*) [32])(*pauVar29 + lVar31),auVar94._0_32_,
                                  auVar166._0_32_);
                  auVar44 = vfmadd213ps_fma(auVar95._0_32_,
                                            *(undefined1 (*) [32])(*pauVar25 + lVar31),
                                            *(undefined1 (*) [32])(*pauVar37 + lVar31));
                  *(undefined1 (*) [32])(*pauVar29 + lVar31) = ZEXT1632(auVar44);
                  lVar31 = lVar31 + 0x20;
                  iVar28 = iVar28 + 8;
                }
                auVar96._16_48_ = auVar95._16_48_;
                auVar96._0_16_ = vbroadcastss_avx512vl(auVar43);
                in_ZMM18 = ZEXT1664(auVar96._0_16_);
                auVar55 = auVar96;
                while (iVar28 + 4 <= iVar35) {
                  auVar55._0_16_ =
                       vfmadd132ps_avx512vl
                                 (*(undefined1 (*) [16])(*pauVar29 + lVar31),auVar96._0_16_,
                                  auVar166._0_16_);
                  auVar44 = vfmadd213ps_fma(auVar55._0_16_,
                                            *(undefined1 (*) [16])(*pauVar25 + lVar31),
                                            *(undefined1 (*) [16])(*pauVar37 + lVar31));
                  *(undefined1 (*) [16])(*pauVar29 + lVar31) = auVar44;
                  lVar31 = lVar31 + 0x10;
                  iVar28 = iVar28 + 4;
                }
                puVar38 = (uint *)(*pauVar37 + lVar31);
                puVar26 = (uint *)(*pauVar25 + lVar31);
                puVar30 = (uint *)(*pauVar29 + lVar31);
                for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
                  auVar55._0_16_ = vfmadd132ss_avx512f(ZEXT416(*puVar30),auVar43,auVar47);
                  auVar44 = vfmadd213ss_fma(ZEXT416(*puVar26),auVar55._0_16_,ZEXT416(*puVar38));
                  *puVar30 = auVar44._0_4_;
                  puVar30 = puVar30 + 1;
                  puVar26 = puVar26 + 1;
                  puVar38 = puVar38 + 1;
                }
              }
            }
          }
        }
      }
      else {
        iVar35 = uVar1 * iVar28 * iVar32;
        fVar112 = 1.0 / (float)(int)(uVar1 * iVar28);
        auVar55 = vbroadcastss_avx512f(ZEXT416((uint)fVar112));
        uVar41 = 0;
        auVar158._8_4_ = 0x80000000;
        auVar158._0_8_ = 0x8000000080000000;
        auVar158._12_4_ = 0x80000000;
        auVar163._8_4_ = 0xc0400000;
        auVar163._0_8_ = 0xc0400000c0400000;
        auVar163._12_4_ = 0xc0400000;
        auVar51._8_4_ = 0xc0400000;
        auVar51._0_8_ = 0xc0400000c0400000;
        auVar51._12_4_ = 0xc0400000;
        auVar51._16_4_ = 0xc0400000;
        auVar51._20_4_ = 0xc0400000;
        auVar51._24_4_ = 0xc0400000;
        auVar51._28_4_ = 0xc0400000;
        auVar58 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
        auVar56 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
        auVar57 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar166._12_4_ = 0;
        auVar166._0_12_ = ZEXT812(0);
        auVar54 = auVar57;
        for (; uVar41 != uVar27; uVar41 = uVar41 + 1) {
          pauVar42 = (undefined1 (*) [64])
                     (bottom_top_blob->cstep * uVar41 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          pauVar25 = pauVar42;
          auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
          iVar28 = 0;
          while (iVar28 + 0x10 <= iVar35) {
            auVar54 = vaddps_avx512f(auVar64,*pauVar25);
            pauVar25 = pauVar25 + 1;
            auVar64 = auVar54;
            iVar28 = iVar28 + 0x10;
          }
          auVar71._16_48_ = auVar54._16_48_;
          auVar71._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          auVar54 = ZEXT1664(auVar71._0_16_);
          while( true ) {
            auVar52 = auVar54._0_32_;
            if (iVar35 < iVar28 + 8) break;
            auVar71._0_32_ = vaddps_avx512vl(auVar52,*(undefined1 (*) [32])*pauVar25);
            auVar54 = ZEXT3264(auVar71._0_32_);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
            iVar28 = iVar28 + 8;
          }
          auVar104._16_48_ = auVar71._16_48_;
          auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          while (iVar28 + 4 <= iVar35) {
            auVar43 = vaddps_avx512vl(auVar43,*(undefined1 (*) [16])*pauVar25);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
            iVar28 = iVar28 + 4;
          }
          auVar104._0_16_ = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          auVar47 = auVar104._0_16_;
          for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
            auVar104._0_16_ = vaddss_avx512f(auVar47,ZEXT416(*(uint *)*pauVar25));
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
            auVar47 = auVar104._0_16_;
          }
          if (iVar32 == 0x10) {
            auVar54 = vmulps_avx512f(auVar64,auVar55);
            auVar52 = vbroadcastss_avx512vl(auVar54._0_16_);
            bVar21 = true;
            bVar23 = false;
            bVar24 = false;
            auVar44 = auVar52._0_16_;
            bVar22 = false;
            auVar64 = auVar54;
            in_ZMM18 = auVar54;
          }
          else {
            auVar97._32_32_ = auVar104._32_32_;
            auVar49 = vextractf64x4_avx512f(auVar64,1);
            auVar50 = auVar64._0_32_;
            if (iVar32 == 4) {
              auVar52 = vaddps_avx512vl(auVar50,auVar52);
              auVar52 = vaddps_avx512vl(auVar52,auVar49);
              auVar43 = vaddps_avx512vl(auVar52._0_16_,auVar43);
              auVar128._0_4_ = auVar52._16_4_ + auVar43._0_4_;
              auVar128._4_4_ = auVar52._20_4_ + auVar43._4_4_;
              auVar128._8_4_ = auVar52._24_4_ + auVar43._8_4_;
              auVar128._12_4_ = auVar52._28_4_ + auVar43._12_4_;
              auVar44 = vmulps_avx512vl(auVar128,auVar55._0_16_);
              auVar64 = ZEXT1664(auVar44);
              auVar52 = vinsertf32x4_avx512vl(ZEXT1632(auVar44),auVar44,1);
              auVar54 = ZEXT3264(auVar52);
              bVar23 = true;
              bVar24 = false;
              in_ZMM18 = auVar64;
LAB_0047f98a:
              bVar22 = false;
            }
            else {
              if (iVar32 != 8) {
                auVar46 = auVar54._0_16_;
                if (iVar32 == 1) {
                  auVar49 = vaddps_avx512vl(auVar50,auVar49);
                  auVar44 = vextractf32x4_avx512vl(auVar49,1);
                  auVar44 = vaddps_avx512vl(auVar49._0_16_,auVar44);
                  auVar45 = vshufpd_avx512vl(auVar44,auVar44,1);
                  auVar44 = vaddps_avx512vl(auVar45,auVar44);
                  auVar45 = vextractf32x4_avx512vl(auVar52,1);
                  auVar46 = vaddps_avx512vl(auVar45,auVar46);
                  auVar45 = vshufps_avx512vl(auVar43,auVar46,0x11);
                  auVar43 = vshufps_avx512vl(auVar43,auVar46,0xbb);
                  auVar43 = vaddps_avx512vl(auVar43,auVar45);
                  auVar46 = vshufpd_avx512vl(auVar43,auVar43,1);
                  auVar43 = vaddps_avx512vl(auVar43,auVar46);
                  auVar43 = vhaddps_avx(auVar43,auVar43);
                  auVar46 = vmovshdup_avx512vl(auVar44);
                  auVar46 = vaddss_avx512f(auVar46,auVar47);
                  auVar44 = vaddss_avx512f(auVar44,auVar46);
                  auVar43 = vmulss_avx512f(ZEXT416((uint)(auVar44._0_4_ + auVar43._0_4_)),
                                           ZEXT416((uint)fVar112));
                  auVar97._0_32_ = vbroadcastss_avx512vl(auVar43);
                  auVar54 = ZEXT3264(auVar97._0_32_);
                  auVar166._16_48_ = auVar97._16_48_;
                  auVar64._4_60_ = auVar166._4_60_;
                  auVar64._0_4_ = auVar97._0_4_;
                  auVar64 = ZEXT1664(auVar64._0_16_);
                  bVar24 = true;
                  bVar23 = false;
                  auVar44 = auVar97._0_16_;
                  in_ZMM18 = ZEXT1664(auVar43);
                }
                else {
                  auVar44 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
                  auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar43 = vxorps_avx512vl(auVar43,auVar43);
                  auVar46 = vxorps_avx512vl(auVar46,auVar46);
                  auVar54 = ZEXT1664(auVar46);
                  bVar23 = false;
                  bVar24 = false;
                  in_ZMM18 = ZEXT1664(auVar43);
                }
                goto LAB_0047f98a;
              }
              auVar52 = vaddps_avx512vl(auVar50,auVar52);
              auVar52 = vaddps_avx512vl(auVar52,auVar49);
              auVar52 = vmulps_avx512vl(auVar52,auVar55._0_32_);
              auVar64 = ZEXT3264(auVar52);
              auVar44 = vbroadcastss_avx512vl(auVar52._0_16_);
              bVar22 = true;
              bVar23 = false;
              in_ZMM18 = ZEXT1664(auVar52._0_16_);
              bVar24 = false;
              auVar54 = auVar64;
            }
            auVar52 = auVar54._0_32_;
            auVar54 = vinsertf64x4_avx512f(auVar54,auVar52,1);
            bVar21 = false;
          }
          auVar98._16_48_ = auVar54._16_48_;
          auVar98._0_16_ = vxorps_avx512vl(auVar47,auVar47);
          pauVar25 = pauVar42;
          in_ZMM19 = ZEXT1664(auVar98._0_16_);
          iVar28 = 0;
          while (iVar28 + 0x10 <= iVar35) {
            auVar71 = vsubps_avx512f(*pauVar25,auVar54);
            auVar98 = vfmadd231ps_avx512f(in_ZMM19,auVar71,auVar71);
            pauVar25 = pauVar25 + 1;
            in_ZMM19 = auVar98;
            iVar28 = iVar28 + 0x10;
          }
          auVar99._16_48_ = auVar98._16_48_;
          auVar99._0_16_ = vxorps_avx512vl(auVar54._0_16_,auVar54._0_16_);
          auVar54 = ZEXT1664(auVar99._0_16_);
          while( true ) {
            auVar49 = auVar54._0_32_;
            if (iVar35 < iVar28 + 8) break;
            auVar50 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar25,auVar52);
            auVar99._0_32_ = vfmadd231ps_avx512vl(auVar49,auVar50,auVar50);
            auVar54 = ZEXT3264(auVar99._0_32_);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
            iVar28 = iVar28 + 8;
          }
          auVar43 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          while (iVar28 + 4 <= iVar35) {
            auVar47 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar25,auVar44);
            auVar43 = vfmadd231ps_avx512vl(auVar43,auVar47,auVar47);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
            iVar28 = iVar28 + 4;
          }
          auVar47 = vxorps_avx512vl(auVar44,auVar44);
          while( true ) {
            in_ZMM21 = ZEXT1664(auVar47);
            if (iVar35 <= iVar28) break;
            auVar44 = vsubss_avx512f(ZEXT416(*(uint *)*pauVar25),in_ZMM18._0_16_);
            auVar47 = vfmadd231ss_avx512f(auVar47,auVar44,auVar44);
            iVar28 = iVar28 + 1;
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
          }
          if (bVar21) {
            in_ZMM16 = vmulps_avx512f(in_ZMM19,auVar55);
            auVar99._32_32_ = in_ZMM16._32_32_;
          }
          else {
            auVar44 = vxorps_avx512vl(auVar52._0_16_,auVar52._0_16_);
            in_ZMM16 = ZEXT1664(auVar44);
          }
          auVar100._0_32_ = vextractf64x4_avx512f(in_ZMM19,1);
          auVar100._32_32_ = auVar99._32_32_;
          auVar52 = in_ZMM19._0_32_;
          auVar54 = auVar100;
          if (bVar22) {
            auVar49 = vaddps_avx512vl(auVar52,auVar49);
            auVar49 = vaddps_avx512vl(auVar49,auVar100._0_32_);
            auVar50 = vmulps_avx512vl(auVar49,auVar55._0_32_);
            auVar54 = vinsertf64x4_avx512f(in_ZMM16,auVar50,0);
            in_ZMM16 = auVar54;
          }
          if (bVar23) {
            auVar49 = vaddps_avx512vl(auVar52,auVar49);
            auVar49 = vaddps_avx512vl(auVar49,auVar100._0_32_);
            auVar44 = vextractf32x4_avx512vl(auVar49,1);
            auVar43 = vaddps_avx512vl(auVar49._0_16_,auVar43);
            auVar43 = vaddps_avx512vl(auVar43,auVar44);
            auVar44 = vmulps_avx512vl(auVar43,auVar55._0_16_);
            auVar54 = vinsertf32x4_avx512f(in_ZMM16,auVar44,0);
            in_ZMM16 = auVar54;
          }
          if (bVar24) {
            auVar101._32_32_ = auVar54._32_32_;
            auVar101._0_32_ = vaddps_avx512vl(auVar52,auVar100._0_32_);
            auVar103._16_48_ = auVar101._16_48_;
            auVar44 = vextractf32x4_avx512vl(auVar101._0_32_,1);
            auVar46 = vaddps_avx512vl(auVar101._0_16_,auVar44);
            auVar45 = vshufpd_avx512vl(auVar46,auVar46,1);
            auVar44 = vextractf32x4_avx512vl(auVar49,1);
            auVar44 = vaddps_avx512vl(auVar44,auVar49._0_16_);
            auVar48 = vshufps_avx512vl(auVar44,auVar43,0x11);
            auVar43 = vshufps_avx512vl(auVar44,auVar43,0xbb);
            auVar44 = vaddps_avx512vl(auVar43,auVar48);
            auVar43 = vshufpd_avx512vl(auVar44,auVar44,1);
            auVar44 = vaddps_avx512vl(auVar44,auVar43);
            auVar44 = vhaddps_avx(auVar44,auVar44);
            auVar46 = vaddps_avx512vl(auVar45,auVar46);
            auVar45 = vmovshdup_avx512vl(auVar46);
            auVar47 = vaddss_avx512f(auVar45,auVar47);
            in_ZMM19 = ZEXT1664(auVar47);
            auVar47 = vaddss_avx512f(auVar46,auVar47);
            auVar103._0_16_ = in_ZMM16._0_16_;
            auVar102._4_60_ = auVar103._4_60_;
            auVar102._0_4_ = (auVar47._0_4_ + auVar44._0_4_) * fVar112;
            auVar54 = vinsertf32x4_avx512f(in_ZMM16,auVar102._0_16_,0);
            in_ZMM16 = auVar54;
          }
          auVar71 = ZEXT1664(auVar43);
          auVar47 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var2[-3]));
          auVar106._16_48_ = auVar54._16_48_;
          auVar43 = in_ZMM16._0_16_;
          if (iVar32 == 1) {
            auVar44 = vaddss_avx512f(auVar43,auVar47);
            auVar47 = vrsqrtss_avx(auVar44,auVar44);
            auVar44 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar44._0_4_ * auVar47._0_4_)),auVar47,
                                          ZEXT416(0xc0400000));
            auVar47 = vmulss_avx512f(auVar47,ZEXT416(0xbf000000));
            fVar141 = auVar47._0_4_ * auVar44._0_4_;
            auVar106._0_16_ = auVar43;
            auVar105._4_60_ = auVar106._4_60_;
            auVar105._0_4_ = fVar141;
            in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar105._0_16_,0);
            auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,auVar158);
            auVar131._4_12_ = auVar64._4_12_;
            auVar131._0_4_ = fVar141 * auVar43._0_4_;
            auVar54 = vinsertf32x4_avx512f(auVar64,auVar131,0);
            in_ZMM22 = auVar54;
          }
          else if (iVar32 == 4) {
            auVar47 = vbroadcastss_avx512vl(auVar47);
            auVar47 = vaddps_avx512vl(auVar43,auVar47);
            auVar43 = vrsqrtps_avx(auVar47);
            auVar129._0_4_ = auVar47._0_4_ * auVar43._0_4_;
            auVar129._4_4_ = auVar47._4_4_ * auVar43._4_4_;
            auVar129._8_4_ = auVar47._8_4_ * auVar43._8_4_;
            auVar129._12_4_ = auVar47._12_4_ * auVar43._12_4_;
            auVar47 = vfmadd213ps_fma(auVar129,auVar43,auVar163);
            auVar130._0_4_ = auVar43._0_4_ * -0.5 * auVar47._0_4_;
            auVar130._4_4_ = auVar43._4_4_ * -0.5 * auVar47._4_4_;
            auVar130._8_4_ = auVar43._8_4_ * -0.5 * auVar47._8_4_;
            auVar130._12_4_ = auVar43._12_4_ * -0.5 * auVar47._12_4_;
            auVar150._0_4_ = auVar130._0_4_ * -auVar64._0_4_;
            auVar150._4_4_ = auVar130._4_4_ * -auVar64._4_4_;
            auVar150._8_4_ = auVar130._8_4_ * -auVar64._8_4_;
            auVar150._12_4_ = auVar130._12_4_ * -auVar64._12_4_;
            in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar130,0);
            auVar54 = vinsertf32x4_avx512f(auVar64,auVar150,0);
            in_ZMM22 = auVar54;
          }
          else if (iVar32 == 8) {
            auVar52 = vbroadcastss_avx512vl(auVar47);
            auVar49 = vaddps_avx512vl(in_ZMM16._0_32_,auVar52);
            auVar52 = vrsqrtps_avx(auVar49);
            auVar53._4_4_ = auVar49._4_4_ * auVar52._4_4_;
            auVar53._0_4_ = auVar49._0_4_ * auVar52._0_4_;
            auVar53._8_4_ = auVar49._8_4_ * auVar52._8_4_;
            auVar53._12_4_ = auVar49._12_4_ * auVar52._12_4_;
            auVar53._16_4_ = auVar49._16_4_ * auVar52._16_4_;
            auVar53._20_4_ = auVar49._20_4_ * auVar52._20_4_;
            auVar53._24_4_ = auVar49._24_4_ * auVar52._24_4_;
            auVar53._28_4_ = auVar49._28_4_;
            auVar43 = vfmadd213ps_fma(auVar53,auVar52,auVar51);
            auVar138._0_4_ = auVar52._0_4_ * -0.5 * auVar43._0_4_;
            auVar138._4_4_ = auVar52._4_4_ * -0.5 * auVar43._4_4_;
            auVar138._8_4_ = auVar52._8_4_ * -0.5 * auVar43._8_4_;
            auVar138._12_4_ = auVar52._12_4_ * -0.5 * auVar43._12_4_;
            auVar138._16_4_ = auVar52._16_4_ * -0.5 * 0.0;
            auVar138._20_4_ = auVar52._20_4_ * -0.5 * 0.0;
            auVar138._24_4_ = auVar52._24_4_ * -0.5 * 0.0;
            auVar138._28_4_ = 0;
            auVar20._4_4_ = auVar138._4_4_ * -auVar64._4_4_;
            auVar20._0_4_ = auVar138._0_4_ * -auVar64._0_4_;
            auVar20._8_4_ = auVar138._8_4_ * -auVar64._8_4_;
            auVar20._12_4_ = auVar138._12_4_ * -auVar64._12_4_;
            auVar20._16_4_ = auVar138._16_4_ * -auVar64._16_4_;
            auVar20._20_4_ = auVar138._20_4_ * -auVar64._20_4_;
            auVar20._24_4_ = auVar138._24_4_ * -auVar64._24_4_;
            auVar20._28_4_ = auVar64._28_4_ ^ 0x80000000;
            in_ZMM16 = vinsertf64x4_avx512f(in_ZMM16,auVar138,0);
            auVar54 = vinsertf64x4_avx512f(auVar64,auVar20,0);
            in_ZMM22 = auVar54;
          }
          else {
            in_ZMM22 = auVar64;
            if (iVar32 == 0x10) {
              auVar54 = vbroadcastss_avx512f(auVar47);
              auVar54 = vaddps_avx512f(in_ZMM16,auVar54);
              auVar104 = vrsqrt14ps_avx512f(auVar54);
              auVar54 = vmulps_avx512f(auVar54,auVar104);
              auVar54 = vfmadd213ps_avx512f(auVar54,auVar104,auVar58);
              auVar104 = vmulps_avx512f(auVar104,auVar56);
              in_ZMM16 = vmulps_avx512f(auVar104,auVar54);
              auVar54 = vxorps_avx512dq(auVar64,auVar57);
              auVar54 = vmulps_avx512f(in_ZMM16,auVar54);
              in_ZMM22 = auVar54;
            }
          }
          auVar47 = in_ZMM16._0_16_;
          auVar52 = in_ZMM16._0_32_;
          auVar43 = in_ZMM22._0_16_;
          auVar49 = in_ZMM22._0_32_;
          if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
            auVar44 = auVar43;
            auVar46 = auVar47;
            if (!bVar23) {
              auVar46 = vbroadcastss_avx512vl(auVar47);
              auVar44 = vbroadcastss_avx512vl(auVar43);
            }
            in_ZMM19 = ZEXT1664(auVar44);
            in_ZMM18 = ZEXT1664(auVar46);
            if (!bVar22) {
              auVar52 = vinsertf32x4_avx512vl(ZEXT1632(auVar46),auVar46,1);
              auVar49 = vinsertf32x4_avx512vl(ZEXT1632(auVar44),auVar44,1);
            }
            in_ZMM21 = ZEXT3264(auVar49);
            if (!bVar21) {
              in_ZMM16 = vinsertf64x4_avx512f(ZEXT3264(auVar52),auVar52,1);
              in_ZMM22 = vinsertf64x4_avx512f(in_ZMM21,auVar49,1);
            }
            auVar54 = in_ZMM22;
            iVar28 = 0;
            while (iVar28 + 0x10 <= iVar35) {
              auVar54 = vfmadd132ps_avx512f(*pauVar42,in_ZMM22,in_ZMM16);
              *pauVar42 = auVar54;
              pauVar42 = pauVar42 + 1;
              iVar28 = iVar28 + 0x10;
            }
            while (iVar28 + 8 <= iVar35) {
              auVar54._0_32_ = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar42,auVar49,auVar52)
              ;
              *(undefined1 (*) [32])*pauVar42 = auVar54._0_32_;
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
              iVar28 = iVar28 + 8;
            }
            while (iVar28 + 4 <= iVar35) {
              auVar54._0_16_ = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar42,auVar44,auVar46)
              ;
              *(undefined1 (*) [16])*pauVar42 = auVar54._0_16_;
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
              iVar28 = iVar28 + 4;
            }
            for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
              auVar54._0_16_ = vfmadd132ss_avx512f(ZEXT416(*(uint *)*pauVar42),auVar43,auVar47);
              *(int *)*pauVar42 = auVar54._0_4_;
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
            }
          }
          else {
            pauVar25 = pauVar4;
            pauVar37 = pauVar5;
            if (bVar21) {
              for (iVar28 = 0x10; iVar28 <= iVar35; iVar28 = iVar28 + 0x10) {
                auVar54 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar25));
                auVar64 = vfmadd132ps_avx512f(*pauVar42,in_ZMM22,in_ZMM16);
                uVar160 = *(undefined4 *)*pauVar37;
                auVar15._4_4_ = uVar160;
                auVar15._0_4_ = uVar160;
                auVar15._8_4_ = uVar160;
                auVar15._12_4_ = uVar160;
                auVar15._16_4_ = uVar160;
                auVar15._20_4_ = uVar160;
                auVar15._24_4_ = uVar160;
                auVar15._28_4_ = uVar160;
                auVar15._32_4_ = uVar160;
                auVar15._36_4_ = uVar160;
                auVar15._40_4_ = uVar160;
                auVar15._44_4_ = uVar160;
                auVar15._48_4_ = uVar160;
                auVar15._52_4_ = uVar160;
                auVar15._56_4_ = uVar160;
                auVar15._60_4_ = uVar160;
                auVar54 = vfmadd213ps_avx512f(auVar64,auVar54,auVar15);
                *pauVar42 = auVar54;
                pauVar42 = pauVar42 + 1;
                pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              }
            }
            pauVar29 = pauVar42;
            if (bVar22) {
              auVar64 = vinsertf64x4_avx512f(in_ZMM16,auVar52,1);
              in_ZMM18 = vinsertf64x4_avx512f(in_ZMM22,auVar49,1);
              lVar31 = 0;
              iVar28 = 8;
              iVar36 = 0;
              auVar54 = in_ZMM18;
              while (iVar36 = iVar36 + 0x10, iVar36 <= iVar35) {
                auVar54 = vpermt2ps_avx512f(ZEXT464(*(uint *)(*pauVar25 + lVar31)),auVar113,
                                            ZEXT464(*(uint *)(*pauVar25 + lVar31 + 4)));
                in_ZMM19 = vpermt2ps_avx512f(ZEXT464(*(uint *)(*pauVar37 + lVar31)),auVar113,
                                             ZEXT464(*(uint *)(*pauVar37 + lVar31 + 4)));
                auVar104 = vfmadd132ps_avx512f(*(undefined1 (*) [64])(*pauVar42 + lVar31 * 8),
                                               in_ZMM18,auVar64);
                auVar54 = vfmadd213ps_avx512f(auVar104,auVar54,in_ZMM19);
                *(undefined1 (*) [64])(*pauVar42 + lVar31 * 8) = auVar54;
                pauVar29 = pauVar29 + 1;
                lVar31 = lVar31 + 8;
                iVar28 = iVar28 + 0x10;
              }
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar31);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar31);
              for (; iVar28 <= iVar35; iVar28 = iVar28 + 8) {
                uVar160 = *(undefined4 *)*pauVar25;
                auVar139._4_4_ = uVar160;
                auVar139._0_4_ = uVar160;
                auVar139._8_4_ = uVar160;
                auVar139._12_4_ = uVar160;
                auVar139._16_4_ = uVar160;
                auVar139._20_4_ = uVar160;
                auVar139._24_4_ = uVar160;
                auVar139._28_4_ = uVar160;
                auVar50 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar29,auVar49,auVar52);
                uVar160 = *(undefined4 *)*pauVar37;
                auVar12._4_4_ = uVar160;
                auVar12._0_4_ = uVar160;
                auVar12._8_4_ = uVar160;
                auVar12._12_4_ = uVar160;
                auVar12._16_4_ = uVar160;
                auVar12._20_4_ = uVar160;
                auVar12._24_4_ = uVar160;
                auVar12._28_4_ = uVar160;
                auVar54._0_32_ = vfmadd213ps_avx512vl(auVar50,auVar139,auVar12);
                *(undefined1 (*) [32])*pauVar29 = auVar54._0_32_;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
                pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              }
            }
            if (bVar23) {
              auVar50 = vpermpd_avx512vl(auVar52,0x44);
              auVar99._32_32_ = vpermpd_avx512vl(auVar49,0x44);
              in_ZMM18 = ZEXT3264(auVar99._32_32_);
              auVar54 = vinsertf64x4_avx512f(in_ZMM16,auVar52,1);
              in_ZMM19 = vpermpd_avx512f(auVar54,0x44);
              auVar54 = vinsertf64x4_avx512f(in_ZMM22,auVar49,1);
              auVar64 = vpermpd_avx512f(auVar54,0x44);
              pauVar42 = pauVar29;
              auVar54 = auVar64;
              for (lVar31 = 0; (int)lVar31 + 0x10 <= iVar35; lVar31 = lVar31 + 0x10) {
                auVar54 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar25 + lVar31 + 8)));
                auVar71 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar25 + lVar31 + 0xc)));
                auVar44 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar25 + lVar31)),
                                           ZEXT416(*(uint *)(*pauVar25 + lVar31 + 4)),0);
                auVar52 = vpermpd_avx512vl(ZEXT1632(auVar44),0x50);
                auVar54 = vinsertf64x4_avx512f(auVar54,auVar52,0);
                auVar107._0_48_ = auVar54._0_48_;
                auVar107._48_8_ = auVar71._48_8_;
                auVar107._56_8_ = auVar71._56_8_;
                auVar54 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + lVar31 + 8)));
                auVar104 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + lVar31 + 0xc)));
                auVar44 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar37 + lVar31)),
                                           ZEXT416(*(uint *)(*pauVar37 + lVar31 + 4)),0);
                auVar52 = vpermpd_avx512vl(ZEXT1632(auVar44),0x50);
                auVar71 = ZEXT3264(auVar52);
                auVar54 = vinsertf64x4_avx512f(auVar54,auVar52,0);
                auVar108._0_48_ = auVar54._0_48_;
                auVar108._48_8_ = auVar104._48_8_;
                auVar108._56_8_ = auVar104._56_8_;
                auVar54 = vfmadd132ps_avx512f(*pauVar42,auVar64,in_ZMM19);
                auVar54 = vfmadd213ps_avx512f(auVar54,auVar107,auVar108);
                *pauVar42 = auVar54;
                pauVar42 = pauVar42 + 1;
                in_ZMM21 = auVar54;
              }
              for (; (int)lVar31 + 8 <= iVar35; lVar31 = lVar31 + 8) {
                auVar44 = vshufps_avx(ZEXT416(*(uint *)(*pauVar25 + lVar31)),
                                      ZEXT416(*(uint *)(*pauVar25 + lVar31 + 4)),0);
                auVar46 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar37 + lVar31)),
                                           ZEXT416(*(uint *)(*pauVar37 + lVar31 + 4)),0);
                auVar52 = vpermpd_avx2(ZEXT1632(auVar44),0x50);
                auVar49 = vpermpd_avx2(ZEXT1632(auVar46),0x50);
                auVar53 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [32])(*pauVar29 + lVar31 * 4),auVar99._32_32_,
                                     auVar50);
                auVar54._0_32_ = vfmadd213ps_avx512vl(auVar53,auVar52,auVar49);
                in_ZMM19 = ZEXT3264(auVar54._0_32_);
                *(undefined1 (*) [32])(*pauVar29 + lVar31 * 4) = auVar54._0_32_;
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
              }
              for (; (int)lVar31 + 4 <= iVar35; lVar31 = lVar31 + 4) {
                uVar160 = *(undefined4 *)(*pauVar25 + lVar31);
                auVar132._4_4_ = uVar160;
                auVar132._0_4_ = uVar160;
                auVar132._8_4_ = uVar160;
                auVar132._12_4_ = uVar160;
                auVar44 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [16])(*pauVar29 + lVar31 * 4),auVar43,auVar47)
                ;
                uVar160 = *(undefined4 *)(*pauVar37 + lVar31);
                auVar8._4_4_ = uVar160;
                auVar8._0_4_ = uVar160;
                auVar8._8_4_ = uVar160;
                auVar8._12_4_ = uVar160;
                auVar54._0_16_ = vfmadd213ps_avx512vl(auVar44,auVar132,auVar8);
                *(undefined1 (*) [16])(*pauVar29 + lVar31 * 4) = auVar54._0_16_;
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
              }
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar31);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar31);
              pauVar29 = pauVar42;
            }
            in_ZMM22 = auVar71;
            if (bVar24) {
              auVar64 = vbroadcastss_avx512f(auVar47);
              auVar71 = vbroadcastss_avx512f(auVar43);
              lVar31 = 0;
              pauVar42 = pauVar25;
              pauVar33 = pauVar37;
              pauVar40 = pauVar29;
              auVar54 = auVar71;
              iVar28 = 0;
              while (iVar28 + 0x10 <= iVar35) {
                auVar54 = vfmadd132ps_avx512f(*pauVar40,auVar71,auVar64);
                auVar54 = vfmadd213ps_avx512f(auVar54,*pauVar42,*pauVar33);
                *pauVar40 = auVar54;
                pauVar40 = pauVar40 + 1;
                pauVar42 = pauVar42 + 1;
                pauVar33 = pauVar33 + 1;
                lVar31 = lVar31 + 0x40;
                iVar28 = iVar28 + 0x10;
              }
              auVar109._32_32_ = auVar54._32_32_;
              auVar109._0_32_ = vbroadcastss_avx512vl(auVar43);
              auVar110 = auVar109;
              while (iVar28 + 8 <= iVar35) {
                auVar110._0_32_ =
                     vfmadd132ps_avx512vl
                               (*(undefined1 (*) [32])(*pauVar29 + lVar31),auVar109._0_32_,
                                auVar64._0_32_);
                auVar44 = vfmadd213ps_fma(auVar110._0_32_,*(undefined1 (*) [32])(*pauVar25 + lVar31)
                                          ,*(undefined1 (*) [32])(*pauVar37 + lVar31));
                *(undefined1 (*) [32])(*pauVar29 + lVar31) = ZEXT1632(auVar44);
                lVar31 = lVar31 + 0x20;
                iVar28 = iVar28 + 8;
              }
              auVar111._16_48_ = auVar110._16_48_;
              auVar111._0_16_ = vbroadcastss_avx512vl(auVar43);
              in_ZMM18 = ZEXT1664(auVar111._0_16_);
              auVar54 = auVar111;
              while (iVar28 + 4 <= iVar35) {
                auVar54._0_16_ =
                     vfmadd132ps_avx512vl
                               (*(undefined1 (*) [16])(*pauVar29 + lVar31),auVar111._0_16_,
                                auVar64._0_16_);
                auVar44 = vfmadd213ps_fma(auVar54._0_16_,*(undefined1 (*) [16])(*pauVar25 + lVar31),
                                          *(undefined1 (*) [16])(*pauVar37 + lVar31));
                *(undefined1 (*) [16])(*pauVar29 + lVar31) = auVar44;
                lVar31 = lVar31 + 0x10;
                iVar28 = iVar28 + 4;
              }
              puVar38 = (uint *)(*pauVar37 + lVar31);
              puVar26 = (uint *)(*pauVar25 + lVar31);
              puVar30 = (uint *)(*pauVar29 + lVar31);
              for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
                auVar54._0_16_ = vfmadd132ss_avx512f(ZEXT416(*puVar30),auVar43,auVar47);
                auVar44 = vfmadd213ss_fma(ZEXT416(*puVar26),auVar54._0_16_,ZEXT416(*puVar38));
                *puVar30 = auVar44._0_4_;
                puVar30 = puVar30 + 1;
                puVar26 = puVar26 + 1;
                puVar38 = puVar38 + 1;
              }
            }
          }
        }
      }
    }
    else if (iVar35 == 2) {
      iVar35 = iVar28 * iVar32;
      fVar112 = 1.0 / (float)iVar28;
      uVar41 = 0;
      uVar27 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar27 = uVar41;
      }
      auVar54 = vbroadcastss_avx512f(ZEXT416((uint)fVar112));
      auVar146._8_4_ = 0x80000000;
      auVar146._0_8_ = 0x8000000080000000;
      auVar146._12_4_ = 0x80000000;
      auVar161._8_4_ = 0xc0400000;
      auVar161._0_8_ = 0xc0400000c0400000;
      auVar161._12_4_ = 0xc0400000;
      auVar164._8_4_ = 0xc0400000;
      auVar164._0_8_ = 0xc0400000c0400000;
      auVar164._12_4_ = 0xc0400000;
      auVar164._16_4_ = 0xc0400000;
      auVar164._20_4_ = 0xc0400000;
      auVar164._24_4_ = 0xc0400000;
      auVar164._28_4_ = 0xc0400000;
      auVar55 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
      auVar56 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
      auVar57 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar63._12_4_ = 0;
      auVar63._0_12_ = ZEXT812(0);
      auVar58 = auVar57;
      for (; uVar41 != uVar27; uVar41 = uVar41 + 1) {
        pauVar42 = (undefined1 (*) [64])
                   ((long)bottom_top_blob->w * uVar41 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        pauVar25 = pauVar42;
        auVar166 = ZEXT1664(ZEXT816(0) << 0x40);
        iVar28 = 0;
        while (iVar28 + 0x10 <= iVar35) {
          auVar58 = vaddps_avx512f(auVar166,*pauVar25);
          pauVar25 = pauVar25 + 1;
          auVar166 = auVar58;
          iVar28 = iVar28 + 0x10;
        }
        auVar59._16_48_ = auVar58._16_48_;
        auVar59._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        auVar58 = ZEXT1664(auVar59._0_16_);
        while( true ) {
          auVar52 = auVar58._0_32_;
          if (iVar35 < iVar28 + 8) break;
          auVar59._0_32_ = vaddps_avx512vl(auVar52,*(undefined1 (*) [32])*pauVar25);
          auVar58 = ZEXT3264(auVar59._0_32_);
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
          iVar28 = iVar28 + 8;
        }
        auVar60._16_48_ = auVar59._16_48_;
        auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        while (iVar28 + 4 <= iVar35) {
          auVar43 = vaddps_avx512vl(auVar43,*(undefined1 (*) [16])*pauVar25);
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
          iVar28 = iVar28 + 4;
        }
        auVar60._0_16_ = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        auVar47 = auVar60._0_16_;
        for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
          auVar60._0_16_ = vaddss_avx512f(auVar47,ZEXT416(*(uint *)*pauVar25));
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
          auVar47 = auVar60._0_16_;
        }
        if (iVar32 == 0x10) {
          auVar58 = vmulps_avx512f(auVar166,auVar54);
          auVar52 = vbroadcastss_avx512vl(auVar58._0_16_);
          bVar21 = true;
          bVar23 = false;
          bVar24 = false;
          auVar44 = auVar52._0_16_;
          bVar22 = false;
          auVar166 = auVar58;
          in_ZMM18 = auVar58;
        }
        else {
          auVar61._32_32_ = auVar60._32_32_;
          auVar49 = vextractf64x4_avx512f(auVar166,1);
          auVar50 = auVar166._0_32_;
          if (iVar32 == 4) {
            auVar52 = vaddps_avx512vl(auVar50,auVar52);
            auVar52 = vaddps_avx512vl(auVar52,auVar49);
            auVar43 = vaddps_avx512vl(auVar52._0_16_,auVar43);
            auVar116._0_4_ = auVar52._16_4_ + auVar43._0_4_;
            auVar116._4_4_ = auVar52._20_4_ + auVar43._4_4_;
            auVar116._8_4_ = auVar52._24_4_ + auVar43._8_4_;
            auVar116._12_4_ = auVar52._28_4_ + auVar43._12_4_;
            auVar44 = vmulps_avx512vl(auVar116,auVar54._0_16_);
            auVar166 = ZEXT1664(auVar44);
            auVar52 = vinsertf32x4_avx512vl(ZEXT1632(auVar44),auVar44,1);
            auVar58 = ZEXT3264(auVar52);
            bVar23 = true;
            bVar24 = false;
            in_ZMM18 = auVar166;
LAB_0047e287:
            bVar22 = false;
          }
          else {
            if (iVar32 != 8) {
              auVar46 = auVar58._0_16_;
              if (iVar32 == 1) {
                auVar49 = vaddps_avx512vl(auVar50,auVar49);
                auVar44 = vextractf32x4_avx512vl(auVar49,1);
                auVar44 = vaddps_avx512vl(auVar49._0_16_,auVar44);
                auVar45 = vshufpd_avx512vl(auVar44,auVar44,1);
                auVar44 = vaddps_avx512vl(auVar45,auVar44);
                auVar45 = vextractf32x4_avx512vl(auVar52,1);
                auVar46 = vaddps_avx512vl(auVar45,auVar46);
                auVar45 = vshufps_avx512vl(auVar43,auVar46,0x11);
                auVar43 = vshufps_avx512vl(auVar43,auVar46,0xbb);
                auVar43 = vaddps_avx512vl(auVar43,auVar45);
                auVar46 = vshufpd_avx512vl(auVar43,auVar43,1);
                auVar43 = vaddps_avx512vl(auVar43,auVar46);
                auVar43 = vhaddps_avx(auVar43,auVar43);
                auVar46 = vmovshdup_avx512vl(auVar44);
                auVar46 = vaddss_avx512f(auVar46,auVar47);
                auVar44 = vaddss_avx512f(auVar44,auVar46);
                auVar43 = vmulss_avx512f(ZEXT416((uint)(auVar44._0_4_ + auVar43._0_4_)),
                                         ZEXT416((uint)fVar112));
                auVar61._0_32_ = vbroadcastss_avx512vl(auVar43);
                auVar58 = ZEXT3264(auVar61._0_32_);
                auVar63._16_48_ = auVar61._16_48_;
                auVar62._4_60_ = auVar63._4_60_;
                auVar62._0_4_ = auVar61._0_4_;
                auVar166 = ZEXT1664(auVar62._0_16_);
                bVar24 = true;
                bVar23 = false;
                auVar44 = auVar61._0_16_;
                in_ZMM18 = ZEXT1664(auVar43);
              }
              else {
                auVar44 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
                auVar166 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar43 = vxorps_avx512vl(auVar43,auVar43);
                auVar46 = vxorps_avx512vl(auVar46,auVar46);
                auVar58 = ZEXT1664(auVar46);
                bVar23 = false;
                bVar24 = false;
                in_ZMM18 = ZEXT1664(auVar43);
              }
              goto LAB_0047e287;
            }
            auVar52 = vaddps_avx512vl(auVar50,auVar52);
            auVar52 = vaddps_avx512vl(auVar52,auVar49);
            auVar52 = vmulps_avx512vl(auVar52,auVar54._0_32_);
            auVar166 = ZEXT3264(auVar52);
            auVar44 = vbroadcastss_avx512vl(auVar52._0_16_);
            bVar22 = true;
            bVar23 = false;
            in_ZMM18 = ZEXT1664(auVar52._0_16_);
            bVar24 = false;
            auVar58 = auVar166;
          }
          auVar52 = auVar58._0_32_;
          auVar58 = vinsertf64x4_avx512f(auVar58,auVar52,1);
          bVar21 = false;
        }
        auVar65._16_48_ = auVar58._16_48_;
        auVar65._0_16_ = vxorps_avx512vl(auVar47,auVar47);
        pauVar25 = pauVar42;
        in_ZMM19 = ZEXT1664(auVar65._0_16_);
        iVar28 = 0;
        while (iVar28 + 0x10 <= iVar35) {
          auVar64 = vsubps_avx512f(*pauVar25,auVar58);
          auVar65 = vfmadd231ps_avx512f(in_ZMM19,auVar64,auVar64);
          pauVar25 = pauVar25 + 1;
          in_ZMM19 = auVar65;
          iVar28 = iVar28 + 0x10;
        }
        auVar66._16_48_ = auVar65._16_48_;
        auVar66._0_16_ = vxorps_avx512vl(auVar58._0_16_,auVar58._0_16_);
        auVar58 = ZEXT1664(auVar66._0_16_);
        while( true ) {
          auVar49 = auVar58._0_32_;
          if (iVar35 < iVar28 + 8) break;
          auVar50 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar25,auVar52);
          auVar66._0_32_ = vfmadd231ps_avx512vl(auVar49,auVar50,auVar50);
          auVar58 = ZEXT3264(auVar66._0_32_);
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
          iVar28 = iVar28 + 8;
        }
        auVar43 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        while (iVar28 + 4 <= iVar35) {
          auVar47 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar25,auVar44);
          auVar43 = vfmadd231ps_avx512vl(auVar43,auVar47,auVar47);
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
          iVar28 = iVar28 + 4;
        }
        auVar47 = vxorps_avx512vl(auVar44,auVar44);
        while( true ) {
          in_ZMM21 = ZEXT1664(auVar47);
          if (iVar35 <= iVar28) break;
          auVar44 = vsubss_avx512f(ZEXT416(*(uint *)*pauVar25),in_ZMM18._0_16_);
          auVar47 = vfmadd231ss_avx512f(auVar47,auVar44,auVar44);
          iVar28 = iVar28 + 1;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
        }
        if (bVar21) {
          in_ZMM16 = vmulps_avx512f(in_ZMM19,auVar54);
          auVar66._32_32_ = in_ZMM16._32_32_;
        }
        else {
          auVar44 = vxorps_avx512vl(auVar52._0_16_,auVar52._0_16_);
          in_ZMM16 = ZEXT1664(auVar44);
        }
        auVar67._0_32_ = vextractf64x4_avx512f(in_ZMM19,1);
        auVar67._32_32_ = auVar66._32_32_;
        auVar52 = in_ZMM19._0_32_;
        auVar58 = auVar67;
        if (bVar22) {
          auVar49 = vaddps_avx512vl(auVar52,auVar49);
          auVar49 = vaddps_avx512vl(auVar49,auVar67._0_32_);
          auVar50 = vmulps_avx512vl(auVar49,auVar54._0_32_);
          auVar58 = vinsertf64x4_avx512f(in_ZMM16,auVar50,0);
          in_ZMM16 = auVar58;
        }
        if (bVar23) {
          auVar49 = vaddps_avx512vl(auVar52,auVar49);
          auVar49 = vaddps_avx512vl(auVar49,auVar67._0_32_);
          auVar44 = vextractf32x4_avx512vl(auVar49,1);
          auVar43 = vaddps_avx512vl(auVar49._0_16_,auVar43);
          auVar43 = vaddps_avx512vl(auVar43,auVar44);
          auVar44 = vmulps_avx512vl(auVar43,auVar54._0_16_);
          auVar58 = vinsertf32x4_avx512f(in_ZMM16,auVar44,0);
          in_ZMM16 = auVar58;
        }
        if (bVar24) {
          auVar68._32_32_ = auVar58._32_32_;
          auVar68._0_32_ = vaddps_avx512vl(auVar52,auVar67._0_32_);
          auVar70._16_48_ = auVar68._16_48_;
          auVar44 = vextractf32x4_avx512vl(auVar68._0_32_,1);
          auVar46 = vaddps_avx512vl(auVar68._0_16_,auVar44);
          auVar45 = vshufpd_avx512vl(auVar46,auVar46,1);
          auVar44 = vextractf32x4_avx512vl(auVar49,1);
          auVar44 = vaddps_avx512vl(auVar44,auVar49._0_16_);
          auVar48 = vshufps_avx512vl(auVar44,auVar43,0x11);
          auVar43 = vshufps_avx512vl(auVar44,auVar43,0xbb);
          auVar44 = vaddps_avx512vl(auVar43,auVar48);
          auVar43 = vshufpd_avx512vl(auVar44,auVar44,1);
          auVar44 = vaddps_avx512vl(auVar44,auVar43);
          auVar44 = vhaddps_avx(auVar44,auVar44);
          auVar46 = vaddps_avx512vl(auVar45,auVar46);
          auVar45 = vmovshdup_avx512vl(auVar46);
          auVar47 = vaddss_avx512f(auVar45,auVar47);
          in_ZMM19 = ZEXT1664(auVar47);
          auVar47 = vaddss_avx512f(auVar46,auVar47);
          auVar70._0_16_ = in_ZMM16._0_16_;
          auVar69._4_60_ = auVar70._4_60_;
          auVar69._0_4_ = (auVar47._0_4_ + auVar44._0_4_) * fVar112;
          auVar58 = vinsertf32x4_avx512f(in_ZMM16,auVar69._0_16_,0);
          in_ZMM16 = auVar58;
        }
        auVar64 = ZEXT1664(auVar43);
        auVar47 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var2[-3]));
        auVar73._16_48_ = auVar58._16_48_;
        auVar43 = in_ZMM16._0_16_;
        if (iVar32 == 1) {
          auVar44 = vaddss_avx512f(auVar43,auVar47);
          auVar47 = vrsqrtss_avx(auVar44,auVar44);
          auVar44 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar44._0_4_ * auVar47._0_4_)),auVar47,
                                        ZEXT416(0xc0400000));
          auVar47 = vmulss_avx512f(auVar47,ZEXT416(0xbf000000));
          fVar141 = auVar47._0_4_ * auVar44._0_4_;
          auVar73._0_16_ = auVar43;
          auVar72._4_60_ = auVar73._4_60_;
          auVar72._0_4_ = fVar141;
          in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar72._0_16_,0);
          auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,auVar146);
          auVar119._4_12_ = auVar166._4_12_;
          auVar119._0_4_ = fVar141 * auVar43._0_4_;
          auVar58 = vinsertf32x4_avx512f(auVar166,auVar119,0);
          in_ZMM22 = auVar58;
        }
        else if (iVar32 == 4) {
          auVar47 = vbroadcastss_avx512vl(auVar47);
          auVar47 = vaddps_avx512vl(auVar43,auVar47);
          auVar43 = vrsqrtps_avx(auVar47);
          auVar117._0_4_ = auVar47._0_4_ * auVar43._0_4_;
          auVar117._4_4_ = auVar47._4_4_ * auVar43._4_4_;
          auVar117._8_4_ = auVar47._8_4_ * auVar43._8_4_;
          auVar117._12_4_ = auVar47._12_4_ * auVar43._12_4_;
          auVar47 = vfmadd213ps_fma(auVar117,auVar43,auVar161);
          auVar118._0_4_ = auVar43._0_4_ * -0.5 * auVar47._0_4_;
          auVar118._4_4_ = auVar43._4_4_ * -0.5 * auVar47._4_4_;
          auVar118._8_4_ = auVar43._8_4_ * -0.5 * auVar47._8_4_;
          auVar118._12_4_ = auVar43._12_4_ * -0.5 * auVar47._12_4_;
          auVar152._0_4_ = auVar118._0_4_ * -auVar166._0_4_;
          auVar152._4_4_ = auVar118._4_4_ * -auVar166._4_4_;
          auVar152._8_4_ = auVar118._8_4_ * -auVar166._8_4_;
          auVar152._12_4_ = auVar118._12_4_ * -auVar166._12_4_;
          in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar118,0);
          auVar58 = vinsertf32x4_avx512f(auVar166,auVar152,0);
          in_ZMM22 = auVar58;
        }
        else if (iVar32 == 8) {
          auVar52 = vbroadcastss_avx512vl(auVar47);
          auVar49 = vaddps_avx512vl(in_ZMM16._0_32_,auVar52);
          auVar52 = vrsqrtps_avx(auVar49);
          auVar16._4_4_ = auVar49._4_4_ * auVar52._4_4_;
          auVar16._0_4_ = auVar49._0_4_ * auVar52._0_4_;
          auVar16._8_4_ = auVar49._8_4_ * auVar52._8_4_;
          auVar16._12_4_ = auVar49._12_4_ * auVar52._12_4_;
          auVar16._16_4_ = auVar49._16_4_ * auVar52._16_4_;
          auVar16._20_4_ = auVar49._20_4_ * auVar52._20_4_;
          auVar16._24_4_ = auVar49._24_4_ * auVar52._24_4_;
          auVar16._28_4_ = auVar49._28_4_;
          auVar43 = vfmadd213ps_fma(auVar16,auVar52,auVar164);
          auVar134._0_4_ = auVar52._0_4_ * -0.5 * auVar43._0_4_;
          auVar134._4_4_ = auVar52._4_4_ * -0.5 * auVar43._4_4_;
          auVar134._8_4_ = auVar52._8_4_ * -0.5 * auVar43._8_4_;
          auVar134._12_4_ = auVar52._12_4_ * -0.5 * auVar43._12_4_;
          auVar134._16_4_ = auVar52._16_4_ * -0.5 * 0.0;
          auVar134._20_4_ = auVar52._20_4_ * -0.5 * 0.0;
          auVar134._24_4_ = auVar52._24_4_ * -0.5 * 0.0;
          auVar134._28_4_ = 0;
          auVar17._4_4_ = auVar134._4_4_ * -auVar166._4_4_;
          auVar17._0_4_ = auVar134._0_4_ * -auVar166._0_4_;
          auVar17._8_4_ = auVar134._8_4_ * -auVar166._8_4_;
          auVar17._12_4_ = auVar134._12_4_ * -auVar166._12_4_;
          auVar17._16_4_ = auVar134._16_4_ * -auVar166._16_4_;
          auVar17._20_4_ = auVar134._20_4_ * -auVar166._20_4_;
          auVar17._24_4_ = auVar134._24_4_ * -auVar166._24_4_;
          auVar17._28_4_ = auVar166._28_4_ ^ 0x80000000;
          in_ZMM16 = vinsertf64x4_avx512f(in_ZMM16,auVar134,0);
          auVar58 = vinsertf64x4_avx512f(auVar166,auVar17,0);
          in_ZMM22 = auVar58;
        }
        else {
          in_ZMM22 = auVar166;
          if (iVar32 == 0x10) {
            auVar58 = vbroadcastss_avx512f(auVar47);
            auVar58 = vaddps_avx512f(in_ZMM16,auVar58);
            auVar71 = vrsqrt14ps_avx512f(auVar58);
            auVar58 = vmulps_avx512f(auVar58,auVar71);
            auVar58 = vfmadd213ps_avx512f(auVar58,auVar71,auVar55);
            auVar71 = vmulps_avx512f(auVar71,auVar56);
            in_ZMM16 = vmulps_avx512f(auVar71,auVar58);
            auVar58 = vxorps_avx512dq(auVar166,auVar57);
            auVar58 = vmulps_avx512f(in_ZMM16,auVar58);
            in_ZMM22 = auVar58;
          }
        }
        auVar47 = in_ZMM16._0_16_;
        auVar52 = in_ZMM16._0_32_;
        auVar43 = in_ZMM22._0_16_;
        auVar49 = in_ZMM22._0_32_;
        if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
          auVar44 = auVar43;
          auVar46 = auVar47;
          if (!bVar23) {
            auVar46 = vbroadcastss_avx512vl(auVar47);
            auVar44 = vbroadcastss_avx512vl(auVar43);
          }
          in_ZMM19 = ZEXT1664(auVar44);
          in_ZMM18 = ZEXT1664(auVar46);
          if (!bVar22) {
            auVar52 = vinsertf32x4_avx512vl(ZEXT1632(auVar46),auVar46,1);
            auVar49 = vinsertf32x4_avx512vl(ZEXT1632(auVar44),auVar44,1);
          }
          in_ZMM21 = ZEXT3264(auVar49);
          if (!bVar21) {
            in_ZMM16 = vinsertf64x4_avx512f(ZEXT3264(auVar52),auVar52,1);
            in_ZMM22 = vinsertf64x4_avx512f(in_ZMM21,auVar49,1);
          }
          auVar58 = in_ZMM22;
          iVar28 = 0;
          while (iVar28 + 0x10 <= iVar35) {
            auVar58 = vfmadd132ps_avx512f(*pauVar42,in_ZMM22,in_ZMM16);
            *pauVar42 = auVar58;
            pauVar42 = pauVar42 + 1;
            iVar28 = iVar28 + 0x10;
          }
          while (iVar28 + 8 <= iVar35) {
            auVar58._0_32_ = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar42,auVar49,auVar52);
            *(undefined1 (*) [32])*pauVar42 = auVar58._0_32_;
            pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
            iVar28 = iVar28 + 8;
          }
          while (iVar28 + 4 <= iVar35) {
            auVar58._0_16_ = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar42,auVar44,auVar46);
            *(undefined1 (*) [16])*pauVar42 = auVar58._0_16_;
            pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
            iVar28 = iVar28 + 4;
          }
          for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
            auVar58._0_16_ = vfmadd132ss_avx512f(ZEXT416(*(uint *)*pauVar42),auVar43,auVar47);
            *(int *)*pauVar42 = auVar58._0_4_;
            pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
          }
        }
        else {
          pauVar25 = pauVar4;
          pauVar37 = pauVar5;
          if (bVar21) {
            for (iVar28 = 0x10; iVar28 <= iVar35; iVar28 = iVar28 + 0x10) {
              auVar58 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar25));
              auVar166 = vfmadd132ps_avx512f(*pauVar42,in_ZMM22,in_ZMM16);
              uVar160 = *(undefined4 *)*pauVar37;
              auVar13._4_4_ = uVar160;
              auVar13._0_4_ = uVar160;
              auVar13._8_4_ = uVar160;
              auVar13._12_4_ = uVar160;
              auVar13._16_4_ = uVar160;
              auVar13._20_4_ = uVar160;
              auVar13._24_4_ = uVar160;
              auVar13._28_4_ = uVar160;
              auVar13._32_4_ = uVar160;
              auVar13._36_4_ = uVar160;
              auVar13._40_4_ = uVar160;
              auVar13._44_4_ = uVar160;
              auVar13._48_4_ = uVar160;
              auVar13._52_4_ = uVar160;
              auVar13._56_4_ = uVar160;
              auVar13._60_4_ = uVar160;
              auVar58 = vfmadd213ps_avx512f(auVar166,auVar58,auVar13);
              *pauVar42 = auVar58;
              pauVar42 = pauVar42 + 1;
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
            }
          }
          pauVar29 = pauVar42;
          if (bVar22) {
            auVar166 = vinsertf64x4_avx512f(in_ZMM16,auVar52,1);
            in_ZMM18 = vinsertf64x4_avx512f(in_ZMM22,auVar49,1);
            lVar31 = 0;
            iVar28 = 8;
            iVar36 = 0;
            auVar58 = in_ZMM18;
            while (iVar36 = iVar36 + 0x10, iVar36 <= iVar35) {
              auVar58 = vpermt2ps_avx512f(ZEXT464(*(uint *)(*pauVar25 + lVar31)),auVar113,
                                          ZEXT464(*(uint *)(*pauVar25 + lVar31 + 4)));
              in_ZMM19 = vpermt2ps_avx512f(ZEXT464(*(uint *)(*pauVar37 + lVar31)),auVar113,
                                           ZEXT464(*(uint *)(*pauVar37 + lVar31 + 4)));
              auVar71 = vfmadd132ps_avx512f(*(undefined1 (*) [64])(*pauVar42 + lVar31 * 8),in_ZMM18,
                                            auVar166);
              auVar58 = vfmadd213ps_avx512f(auVar71,auVar58,in_ZMM19);
              *(undefined1 (*) [64])(*pauVar42 + lVar31 * 8) = auVar58;
              pauVar29 = pauVar29 + 1;
              lVar31 = lVar31 + 8;
              iVar28 = iVar28 + 0x10;
            }
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar31);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar31);
            for (; iVar28 <= iVar35; iVar28 = iVar28 + 8) {
              uVar160 = *(undefined4 *)*pauVar25;
              auVar135._4_4_ = uVar160;
              auVar135._0_4_ = uVar160;
              auVar135._8_4_ = uVar160;
              auVar135._12_4_ = uVar160;
              auVar135._16_4_ = uVar160;
              auVar135._20_4_ = uVar160;
              auVar135._24_4_ = uVar160;
              auVar135._28_4_ = uVar160;
              auVar50 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar29,auVar49,auVar52);
              uVar160 = *(undefined4 *)*pauVar37;
              auVar10._4_4_ = uVar160;
              auVar10._0_4_ = uVar160;
              auVar10._8_4_ = uVar160;
              auVar10._12_4_ = uVar160;
              auVar10._16_4_ = uVar160;
              auVar10._20_4_ = uVar160;
              auVar10._24_4_ = uVar160;
              auVar10._28_4_ = uVar160;
              auVar58._0_32_ = vfmadd213ps_avx512vl(auVar50,auVar135,auVar10);
              *(undefined1 (*) [32])*pauVar29 = auVar58._0_32_;
              pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
            }
          }
          if (bVar23) {
            auVar50 = vpermpd_avx512vl(auVar52,0x44);
            auVar51 = vpermpd_avx512vl(auVar49,0x44);
            in_ZMM18 = ZEXT3264(auVar51);
            auVar58 = vinsertf64x4_avx512f(in_ZMM16,auVar52,1);
            in_ZMM19 = vpermpd_avx512f(auVar58,0x44);
            auVar58 = vinsertf64x4_avx512f(in_ZMM22,auVar49,1);
            auVar166 = vpermpd_avx512f(auVar58,0x44);
            pauVar42 = pauVar29;
            auVar58 = auVar166;
            for (lVar31 = 0; (int)lVar31 + 0x10 <= iVar35; lVar31 = lVar31 + 0x10) {
              auVar58 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar25 + lVar31 + 8)));
              auVar64 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar25 + lVar31 + 0xc)));
              auVar44 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar25 + lVar31)),
                                         ZEXT416(*(uint *)(*pauVar25 + lVar31 + 4)),0);
              auVar52 = vpermpd_avx512vl(ZEXT1632(auVar44),0x50);
              auVar58 = vinsertf64x4_avx512f(auVar58,auVar52,0);
              auVar74._0_48_ = auVar58._0_48_;
              auVar74._48_8_ = auVar64._48_8_;
              auVar74._56_8_ = auVar64._56_8_;
              auVar58 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + lVar31 + 8)));
              auVar71 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + lVar31 + 0xc)));
              auVar44 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar37 + lVar31)),
                                         ZEXT416(*(uint *)(*pauVar37 + lVar31 + 4)),0);
              auVar52 = vpermpd_avx512vl(ZEXT1632(auVar44),0x50);
              auVar64 = ZEXT3264(auVar52);
              auVar58 = vinsertf64x4_avx512f(auVar58,auVar52,0);
              auVar75._0_48_ = auVar58._0_48_;
              auVar75._48_8_ = auVar71._48_8_;
              auVar75._56_8_ = auVar71._56_8_;
              auVar58 = vfmadd132ps_avx512f(*pauVar42,auVar166,in_ZMM19);
              auVar58 = vfmadd213ps_avx512f(auVar58,auVar74,auVar75);
              *pauVar42 = auVar58;
              pauVar42 = pauVar42 + 1;
              in_ZMM21 = auVar58;
            }
            for (; (int)lVar31 + 8 <= iVar35; lVar31 = lVar31 + 8) {
              auVar44 = vshufps_avx(ZEXT416(*(uint *)(*pauVar25 + lVar31)),
                                    ZEXT416(*(uint *)(*pauVar25 + lVar31 + 4)),0);
              auVar46 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar37 + lVar31)),
                                         ZEXT416(*(uint *)(*pauVar37 + lVar31 + 4)),0);
              auVar52 = vpermpd_avx2(ZEXT1632(auVar44),0x50);
              auVar49 = vpermpd_avx2(ZEXT1632(auVar46),0x50);
              auVar99._32_32_ =
                   vfmadd132ps_avx512vl
                             (*(undefined1 (*) [32])(*pauVar29 + lVar31 * 4),auVar51,auVar50);
              auVar58._0_32_ = vfmadd213ps_avx512vl(auVar99._32_32_,auVar52,auVar49);
              in_ZMM19 = ZEXT3264(auVar58._0_32_);
              *(undefined1 (*) [32])(*pauVar29 + lVar31 * 4) = auVar58._0_32_;
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
            }
            for (; (int)lVar31 + 4 <= iVar35; lVar31 = lVar31 + 4) {
              uVar160 = *(undefined4 *)(*pauVar25 + lVar31);
              auVar120._4_4_ = uVar160;
              auVar120._0_4_ = uVar160;
              auVar120._8_4_ = uVar160;
              auVar120._12_4_ = uVar160;
              auVar44 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [16])(*pauVar29 + lVar31 * 4),auVar43,auVar47);
              uVar160 = *(undefined4 *)(*pauVar37 + lVar31);
              auVar6._4_4_ = uVar160;
              auVar6._0_4_ = uVar160;
              auVar6._8_4_ = uVar160;
              auVar6._12_4_ = uVar160;
              auVar58._0_16_ = vfmadd213ps_avx512vl(auVar44,auVar120,auVar6);
              *(undefined1 (*) [16])(*pauVar29 + lVar31 * 4) = auVar58._0_16_;
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
            }
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar31);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar31);
            pauVar29 = pauVar42;
          }
          in_ZMM22 = auVar64;
          if (bVar24) {
            auVar166 = vbroadcastss_avx512f(auVar47);
            auVar64 = vbroadcastss_avx512f(auVar43);
            lVar31 = 0;
            pauVar42 = pauVar25;
            pauVar33 = pauVar37;
            pauVar40 = pauVar29;
            auVar58 = auVar64;
            iVar28 = 0;
            while (iVar28 + 0x10 <= iVar35) {
              auVar58 = vfmadd132ps_avx512f(*pauVar40,auVar64,auVar166);
              auVar58 = vfmadd213ps_avx512f(auVar58,*pauVar42,*pauVar33);
              *pauVar40 = auVar58;
              pauVar40 = pauVar40 + 1;
              pauVar42 = pauVar42 + 1;
              pauVar33 = pauVar33 + 1;
              lVar31 = lVar31 + 0x40;
              iVar28 = iVar28 + 0x10;
            }
            auVar76._32_32_ = auVar58._32_32_;
            auVar76._0_32_ = vbroadcastss_avx512vl(auVar43);
            auVar77 = auVar76;
            while (iVar28 + 8 <= iVar35) {
              auVar77._0_32_ =
                   vfmadd132ps_avx512vl
                             (*(undefined1 (*) [32])(*pauVar29 + lVar31),auVar76._0_32_,
                              auVar166._0_32_);
              auVar44 = vfmadd213ps_fma(auVar77._0_32_,*(undefined1 (*) [32])(*pauVar25 + lVar31),
                                        *(undefined1 (*) [32])(*pauVar37 + lVar31));
              *(undefined1 (*) [32])(*pauVar29 + lVar31) = ZEXT1632(auVar44);
              lVar31 = lVar31 + 0x20;
              iVar28 = iVar28 + 8;
            }
            auVar78._16_48_ = auVar77._16_48_;
            auVar78._0_16_ = vbroadcastss_avx512vl(auVar43);
            in_ZMM18 = ZEXT1664(auVar78._0_16_);
            auVar58 = auVar78;
            while (iVar28 + 4 <= iVar35) {
              auVar58._0_16_ =
                   vfmadd132ps_avx512vl
                             (*(undefined1 (*) [16])(*pauVar29 + lVar31),auVar78._0_16_,
                              auVar166._0_16_);
              auVar44 = vfmadd213ps_fma(auVar58._0_16_,*(undefined1 (*) [16])(*pauVar25 + lVar31),
                                        *(undefined1 (*) [16])(*pauVar37 + lVar31));
              *(undefined1 (*) [16])(*pauVar29 + lVar31) = auVar44;
              lVar31 = lVar31 + 0x10;
              iVar28 = iVar28 + 4;
            }
            puVar38 = (uint *)(*pauVar37 + lVar31);
            puVar26 = (uint *)(*pauVar25 + lVar31);
            puVar30 = (uint *)(*pauVar29 + lVar31);
            for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
              auVar58._0_16_ = vfmadd132ss_avx512f(ZEXT416(*puVar30),auVar43,auVar47);
              auVar44 = vfmadd213ss_fma(ZEXT416(*puVar26),auVar58._0_16_,ZEXT416(*puVar38));
              *puVar30 = auVar44._0_4_;
              puVar30 = puVar30 + 1;
              puVar26 = puVar26 + 1;
              puVar38 = puVar38 + 1;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}